

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  float *pfVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  uint uVar24;
  ulong uVar25;
  int iVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar27;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar40 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar46 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar49 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar112 [56];
  undefined1 auVar76 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar54 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar57 [32];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar66 [32];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 extraout_var_17 [60];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar69 [32];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar72 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar113 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar152 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar155 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar205;
  undefined1 auVar193 [32];
  undefined1 auVar179 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar202;
  float fVar204;
  float fVar206;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar203;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 in_ZMM3 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar271 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar272 [64];
  undefined1 auVar257 [16];
  undefined1 auVar273 [64];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar263 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar301 [64];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [16];
  undefined1 auVar399 [32];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar400 [32];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar401 [32];
  undefined1 auVar396 [16];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar404 [32];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar440 [16];
  undefined1 auVar452 [32];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [32];
  undefined1 auVar461 [16];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar468 [64];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  __m128 afVar487;
  unary_op_tan op;
  __m256 _p;
  unary_op_tan local_161;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  long local_138;
  undefined8 local_130;
  Mat *local_128;
  undefined1 local_120 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  long local_60;
  undefined1 auVar50 [32];
  undefined1 auVar52 [32];
  undefined1 auVar60 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  
  auVar51 = _DAT_00595120;
  auVar139 = _DAT_00595100;
  auVar29 = in_ZMM3._0_16_;
  auVar152 = in_ZMM5._0_16_;
  local_128 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_fma[-3])) {
  case 0:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar49._8_4_ = 0x7fffffff;
      auVar49._0_8_ = 0x7fffffff7fffffff;
      auVar49._12_4_ = 0x7fffffff;
      auVar49._16_4_ = 0x7fffffff;
      auVar49._20_4_ = 0x7fffffff;
      auVar49._24_4_ = 0x7fffffff;
      auVar49._28_4_ = 0x7fffffff;
      auVar113._8_4_ = 0x7fffffff;
      auVar113._0_8_ = 0x7fffffff7fffffff;
      auVar113._12_4_ = 0x7fffffff;
      auVar210._8_8_ = 0x8000000000000000;
      auVar210._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar152,auVar152);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar196 = vandps_avx(auVar49,*pauVar23);
            *pauVar23 = auVar196;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar152 = vandps_avx(auVar113,*(undefined1 (*) [16])*pauVar23);
          *(undefined1 (*) [16])*pauVar23 = auVar152;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar275._8_8_ = 0;
          auVar275._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar275,0x44);
          auVar152 = vorps_avx(auVar257,auVar210);
          auVar127 = vorps_avx(auVar257,auVar210);
          auVar257 = vorps_avx(auVar257,auVar210);
          uVar25 = 0;
          do {
            auVar351._8_8_ = 0;
            auVar351._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar351,0x44);
            auVar374._16_16_ = auVar342;
            auVar374._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar374,auVar139);
            auVar270 = vorps_avx(auVar374,auVar51);
            auVar405._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar405._8_4_ = auVar270._24_4_;
            auVar405._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar405,auVar152);
            auVar352._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar352._8_4_ = auVar270._8_4_;
            auVar352._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar352,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar406._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar406._8_4_ = auVar196._24_4_;
            auVar406._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar406,auVar152);
            auVar388._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar388._8_4_ = auVar196._8_4_;
            auVar388._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar388,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar368 ^ auVar29,auVar342 ^ auVar29);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar375._16_16_ = auVar342;
            auVar375._0_16_ = auVar368;
            auVar196 = vmaskmovps_avx(auVar375,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar196 = vandps_avx(auVar196,auVar49);
            auVar196 = vmaskmovps_avx(auVar375,auVar196);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 1:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar224._8_8_ = 0x8000000000000000;
      auVar224._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar152,auVar152);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar196 = *pauVar23;
            auVar298._0_8_ = auVar196._0_8_ ^ 0x8000000080000000;
            auVar298._8_4_ = auVar196._8_4_ ^ 0x80000000;
            auVar298._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar298._16_4_ = auVar196._16_4_ ^ 0x80000000;
            auVar298._20_4_ = auVar196._20_4_ ^ 0x80000000;
            auVar298._24_4_ = auVar196._24_4_ ^ 0x80000000;
            auVar298._28_4_ = auVar196._28_4_ ^ 0x80000000;
            *pauVar23 = auVar298;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar152 = *(undefined1 (*) [16])*pauVar23;
          auVar283._0_8_ = auVar152._0_8_ ^ 0x8000000080000000;
          auVar283._8_4_ = auVar152._8_4_ ^ 0x80000000;
          auVar283._12_4_ = auVar152._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar23 = auVar283;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar284._8_8_ = 0;
          auVar284._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar284,0x44);
          auVar152 = vorps_avx(auVar257,auVar224);
          auVar127 = vorps_avx(auVar257,auVar224);
          auVar257 = vorps_avx(auVar257,auVar224);
          uVar25 = 0;
          do {
            auVar366._8_8_ = 0;
            auVar366._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar366,0x44);
            auVar382._16_16_ = auVar342;
            auVar382._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar382,auVar139);
            auVar270 = vorps_avx(auVar382,auVar51);
            auVar414._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar414._8_4_ = auVar270._24_4_;
            auVar414._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar414,auVar152);
            auVar367._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar367._8_4_ = auVar270._8_4_;
            auVar367._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar367,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar415._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar415._8_4_ = auVar196._24_4_;
            auVar415._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar415,auVar152);
            auVar395._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar395._8_4_ = auVar196._8_4_;
            auVar395._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar395,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar368 ^ auVar29,auVar342 ^ auVar29);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar383._16_16_ = auVar342;
            auVar383._0_16_ = auVar368;
            auVar196 = vmaskmovps_avx(auVar383,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar401._0_8_ = auVar196._0_8_ ^ 0x8000000080000000;
            auVar401._8_4_ = auVar196._8_4_ ^ 0x80000000;
            auVar401._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar401._16_4_ = auVar196._16_4_ ^ 0x80000000;
            auVar401._20_4_ = auVar196._20_4_ ^ 0x80000000;
            auVar401._24_4_ = auVar196._24_4_ ^ 0x80000000;
            auVar401._28_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar196 = vmaskmovps_avx(auVar383,auVar401);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 2:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar148._8_8_ = 0x8000000000000000;
      auVar148._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar196 = vroundps_avx(*pauVar23,1);
            *pauVar23 = auVar196;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar152 = vroundps_avx(*(undefined1 (*) [16])*pauVar23,1);
          *(undefined1 (*) [16])*pauVar23 = auVar152;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar219._8_8_ = 0;
          auVar219._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar219,0x44);
          auVar152 = vorps_avx(auVar257,auVar148);
          auVar127 = vorps_avx(auVar257,auVar148);
          auVar257 = vorps_avx(auVar257,auVar148);
          uVar25 = 0;
          do {
            auVar309._8_8_ = 0;
            auVar309._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar309,0x44);
            auVar325._16_16_ = auVar342;
            auVar325._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar325,auVar139);
            auVar270 = vorps_avx(auVar325,auVar51);
            auVar359._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar359._8_4_ = auVar270._24_4_;
            auVar359._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar359,auVar152);
            auVar310._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar310._8_4_ = auVar270._8_4_;
            auVar310._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar310,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar360._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar360._8_4_ = auVar196._24_4_;
            auVar360._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar360,auVar152);
            auVar339._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar339._8_4_ = auVar196._8_4_;
            auVar339._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar339,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar368 ^ auVar29,auVar342 ^ auVar29);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar326._16_16_ = auVar342;
            auVar326._0_16_ = auVar368;
            auVar196 = vmaskmovps_avx(auVar326,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar196 = vroundps_avx(auVar196,9);
            auVar196 = vmaskmovps_avx(auVar326,auVar196);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 3:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar149._8_8_ = 0x8000000000000000;
      auVar149._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar196 = vroundps_avx(*pauVar23,2);
            *pauVar23 = auVar196;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar152 = vroundps_avx(*(undefined1 (*) [16])*pauVar23,2);
          *(undefined1 (*) [16])*pauVar23 = auVar152;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar221._8_8_ = 0;
          auVar221._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar221,0x44);
          auVar152 = vorps_avx(auVar257,auVar149);
          auVar127 = vorps_avx(auVar257,auVar149);
          auVar257 = vorps_avx(auVar257,auVar149);
          uVar25 = 0;
          do {
            auVar311._8_8_ = 0;
            auVar311._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar311,0x44);
            auVar327._16_16_ = auVar342;
            auVar327._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar327,auVar139);
            auVar270 = vorps_avx(auVar327,auVar51);
            auVar363._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar363._8_4_ = auVar270._24_4_;
            auVar363._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar363,auVar152);
            auVar312._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar312._8_4_ = auVar270._8_4_;
            auVar312._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar312,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar364._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar364._8_4_ = auVar196._24_4_;
            auVar364._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar364,auVar152);
            auVar340._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar340._8_4_ = auVar196._8_4_;
            auVar340._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar340,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar368 ^ auVar29,auVar342 ^ auVar29);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar328._16_16_ = auVar342;
            auVar328._0_16_ = auVar368;
            auVar196 = vmaskmovps_avx(auVar328,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar196 = vroundps_avx(auVar196,10);
            auVar196 = vmaskmovps_avx(auVar328,auVar196);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 4:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar146._8_8_ = 0x8000000000000000;
      auVar146._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar4._4_4_ = *(float *)(*pauVar23 + 4) * *(float *)(*pauVar23 + 4);
            auVar4._0_4_ = *(float *)*pauVar23 * *(float *)*pauVar23;
            auVar4._8_4_ = *(float *)(*pauVar23 + 8) * *(float *)(*pauVar23 + 8);
            auVar4._12_4_ = *(float *)(*pauVar23 + 0xc) * *(float *)(*pauVar23 + 0xc);
            auVar4._16_4_ = *(float *)(*pauVar23 + 0x10) * *(float *)(*pauVar23 + 0x10);
            auVar4._20_4_ = *(float *)(*pauVar23 + 0x14) * *(float *)(*pauVar23 + 0x14);
            auVar4._24_4_ = *(float *)(*pauVar23 + 0x18) * *(float *)(*pauVar23 + 0x18);
            auVar4._28_4_ = *(undefined4 *)(*pauVar23 + 0x1c);
            *pauVar23 = auVar4;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar213._0_4_ = *(float *)*pauVar23 * *(float *)*pauVar23;
          auVar213._4_4_ = *(float *)(*pauVar23 + 4) * *(float *)(*pauVar23 + 4);
          auVar213._8_4_ = *(float *)(*pauVar23 + 8) * *(float *)(*pauVar23 + 8);
          auVar213._12_4_ = *(float *)(*pauVar23 + 0xc) * *(float *)(*pauVar23 + 0xc);
          *(undefined1 (*) [16])*pauVar23 = auVar213;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar214._8_8_ = 0;
          auVar214._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar214,0x44);
          auVar152 = vorps_avx(auVar257,auVar146);
          auVar127 = vorps_avx(auVar257,auVar146);
          auVar257 = vorps_avx(auVar257,auVar146);
          uVar25 = 0;
          do {
            auVar305._8_8_ = 0;
            auVar305._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar305,0x44);
            auVar322._16_16_ = auVar342;
            auVar322._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar322,auVar139);
            auVar270 = vorps_avx(auVar322,auVar51);
            auVar355._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar355._8_4_ = auVar270._24_4_;
            auVar355._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar355,auVar152);
            auVar306._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar306._8_4_ = auVar270._8_4_;
            auVar306._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar306,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar356._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar356._8_4_ = auVar196._24_4_;
            auVar356._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar356,auVar152);
            auVar337._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar337._8_4_ = auVar196._8_4_;
            auVar337._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar337,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar368 ^ auVar29,auVar342 ^ auVar29);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar323._16_16_ = auVar342;
            auVar323._0_16_ = auVar368;
            auVar196 = vmaskmovps_avx(auVar323,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar5._4_4_ = auVar196._4_4_ * auVar196._4_4_;
            auVar5._0_4_ = auVar196._0_4_ * auVar196._0_4_;
            auVar5._8_4_ = auVar196._8_4_ * auVar196._8_4_;
            auVar5._12_4_ = auVar196._12_4_ * auVar196._12_4_;
            auVar5._16_4_ = auVar196._16_4_ * auVar196._16_4_;
            auVar5._20_4_ = auVar196._20_4_ * auVar196._20_4_;
            auVar5._24_4_ = auVar196._24_4_ * auVar196._24_4_;
            auVar5._28_4_ = auVar196._28_4_;
            auVar196 = vmaskmovps_avx(auVar323,auVar5);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 5:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar68._8_4_ = 0xc0400000;
      auVar68._0_8_ = 0xc0400000c0400000;
      auVar68._12_4_ = 0xc0400000;
      auVar68._16_4_ = 0xc0400000;
      auVar68._20_4_ = 0xc0400000;
      auVar68._24_4_ = 0xc0400000;
      auVar68._28_4_ = 0xc0400000;
      auVar168._8_4_ = 0x7fffffff;
      auVar168._0_8_ = 0x7fffffff7fffffff;
      auVar168._12_4_ = 0x7fffffff;
      auVar168._16_4_ = 0x7fffffff;
      auVar168._20_4_ = 0x7fffffff;
      auVar168._24_4_ = 0x7fffffff;
      auVar168._28_4_ = 0x7fffffff;
      auVar198._8_4_ = 0x800000;
      auVar198._0_8_ = 0x80000000800000;
      auVar198._12_4_ = 0x800000;
      auVar198._16_4_ = 0x800000;
      auVar198._20_4_ = 0x800000;
      auVar198._24_4_ = 0x800000;
      auVar198._28_4_ = 0x800000;
      auVar314._8_4_ = 0x800000;
      auVar314._0_8_ = 0x80000000800000;
      auVar314._12_4_ = 0x800000;
      auVar396._8_8_ = 0x8000000000000000;
      auVar396._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      do {
        auVar475._8_4_ = 0xc0400000;
        auVar475._0_8_ = 0xc0400000c0400000;
        auVar475._12_4_ = 0xc0400000;
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar196 = *pauVar23;
            auVar270 = vrsqrtps_avx(auVar196);
            auVar468._0_4_ = auVar196._0_4_ * auVar270._0_4_;
            auVar468._4_4_ = auVar196._4_4_ * auVar270._4_4_;
            auVar468._8_4_ = auVar196._8_4_ * auVar270._8_4_;
            auVar468._12_4_ = auVar196._12_4_ * auVar270._12_4_;
            auVar468._16_4_ = auVar196._16_4_ * auVar270._16_4_;
            auVar468._20_4_ = auVar196._20_4_ * auVar270._20_4_;
            auVar468._28_36_ = in_ZMM14._28_36_;
            auVar468._24_4_ = auVar196._24_4_ * auVar270._24_4_;
            auVar152 = vfmadd213ps_fma(auVar270,auVar468._0_32_,auVar68);
            in_ZMM14 = ZEXT3264(CONCAT428(in_ZMM14._28_4_,
                                          CONCAT424(auVar468._24_4_ * -0.5,
                                                    CONCAT420(auVar468._20_4_ * -0.5,
                                                              CONCAT416(auVar468._16_4_ * -0.5,
                                                                        CONCAT412(auVar468._12_4_ *
                                                                                  -0.5,CONCAT48(
                                                  auVar468._8_4_ * -0.5,
                                                  CONCAT44(auVar468._4_4_ * -0.5,
                                                           auVar468._0_4_ * -0.5))))))));
            auVar453._0_4_ = auVar468._0_4_ * -0.5 * auVar152._0_4_;
            auVar453._4_4_ = auVar468._4_4_ * -0.5 * auVar152._4_4_;
            auVar453._8_4_ = auVar468._8_4_ * -0.5 * auVar152._8_4_;
            auVar453._12_4_ = auVar468._12_4_ * -0.5 * auVar152._12_4_;
            auVar453._16_4_ = auVar468._16_4_ * -0.5 * 0.0;
            auVar453._20_4_ = auVar468._20_4_ * -0.5 * 0.0;
            auVar453._24_4_ = auVar468._24_4_ * -0.5 * 0.0;
            auVar453._28_4_ = 0;
            auVar196 = vandps_avx(auVar196,auVar168);
            auVar196 = vcmpps_avx(auVar198,auVar196,2);
            auVar196 = vandps_avx(auVar196,auVar453);
            *pauVar23 = auVar196;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        auVar445._8_4_ = 0x7fffffff;
        auVar445._0_8_ = 0x7fffffff7fffffff;
        auVar445._12_4_ = 0x7fffffff;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar152 = *(undefined1 (*) [16])*pauVar23;
          auVar127 = vrsqrtps_avx(auVar152);
          auVar285._0_4_ = auVar152._0_4_ * auVar127._0_4_;
          auVar285._4_4_ = auVar152._4_4_ * auVar127._4_4_;
          auVar285._8_4_ = auVar152._8_4_ * auVar127._8_4_;
          auVar285._12_4_ = auVar152._12_4_ * auVar127._12_4_;
          auVar127 = vfmadd213ps_fma(auVar127,auVar285,auVar475);
          in_ZMM6 = ZEXT1664(CONCAT412(auVar285._12_4_ * -0.5,
                                       CONCAT48(auVar285._8_4_ * -0.5,
                                                CONCAT44(auVar285._4_4_ * -0.5,auVar285._0_4_ * -0.5
                                                        ))));
          auVar262._0_4_ = auVar285._0_4_ * -0.5 * auVar127._0_4_;
          auVar262._4_4_ = auVar285._4_4_ * -0.5 * auVar127._4_4_;
          auVar262._8_4_ = auVar285._8_4_ * -0.5 * auVar127._8_4_;
          auVar262._12_4_ = auVar285._12_4_ * -0.5 * auVar127._12_4_;
          auVar152 = vandps_avx(auVar445,auVar152);
          auVar152 = vcmpps_avx(auVar314,auVar152,2);
          auVar152 = vandps_avx(auVar152,auVar262);
          *(undefined1 (*) [16])*pauVar23 = auVar152;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar430._8_8_ = 0;
          auVar430._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar430,0x44);
          auVar152 = vorps_avx(auVar257,auVar396);
          auVar127 = vorps_avx(auVar257,auVar396);
          auVar257 = vorps_avx(auVar257,auVar396);
          in_ZMM14 = ZEXT1664(auVar257);
          uVar25 = 0;
          do {
            auVar476._8_8_ = 0;
            auVar476._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar476,0x44);
            auVar485._16_16_ = auVar342;
            auVar485._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar485,auVar139);
            auVar270 = vorps_avx(auVar485,auVar51);
            auVar263._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar263._8_4_ = auVar270._24_4_;
            auVar263._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar263,auVar152);
            auVar477._8_4_ = auVar270._8_4_;
            auVar477._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar477._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar477,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar478._8_4_ = auVar196._24_4_;
            auVar478._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar478._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar478,auVar152);
            auVar229._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar229._8_4_ = auVar196._8_4_;
            auVar229._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar229,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar29 ^ auVar368,auVar29 ^ auVar342);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar248._16_16_ = auVar342;
            auVar248._0_16_ = auVar368;
            auVar270 = vmaskmovps_avx(auVar248,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar196 = vrsqrtps_avx(auVar270);
            auVar301._0_4_ = auVar196._0_4_ * auVar270._0_4_;
            auVar301._4_4_ = auVar196._4_4_ * auVar270._4_4_;
            auVar301._8_4_ = auVar196._8_4_ * auVar270._8_4_;
            auVar301._12_4_ = auVar196._12_4_ * auVar270._12_4_;
            auVar301._16_4_ = auVar196._16_4_ * auVar270._16_4_;
            auVar301._20_4_ = auVar196._20_4_ * auVar270._20_4_;
            auVar301._28_36_ = in_ZMM6._28_36_;
            auVar301._24_4_ = auVar196._24_4_ * auVar270._24_4_;
            auVar342 = vfmadd213ps_fma(auVar196,auVar301._0_32_,auVar68);
            auVar11._4_4_ = auVar342._4_4_ * auVar301._4_4_ * -0.5;
            auVar11._0_4_ = auVar342._0_4_ * auVar301._0_4_ * -0.5;
            auVar11._8_4_ = auVar342._8_4_ * auVar301._8_4_ * -0.5;
            auVar11._12_4_ = auVar342._12_4_ * auVar301._12_4_ * -0.5;
            auVar11._16_4_ = auVar301._16_4_ * -0.5 * 0.0;
            auVar11._20_4_ = auVar301._20_4_ * -0.5 * 0.0;
            auVar11._24_4_ = auVar301._24_4_ * -0.5 * 0.0;
            auVar11._28_4_ = in_ZMM6._28_4_;
            in_ZMM6 = ZEXT3264(auVar11);
            auVar196 = vandps_avx(auVar270,auVar168);
            auVar196 = vcmpps_avx(auVar198,auVar196,2);
            auVar196 = vandps_avx(auVar196,auVar11);
            auVar196 = vmaskmovps_avx(auVar248,auVar196);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 6:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar158._8_8_ = 0x8000000000000000;
      auVar158._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      auVar250._8_4_ = 0xc0400000;
      auVar250._0_8_ = 0xc0400000c0400000;
      auVar250._12_4_ = 0xc0400000;
      auVar250._16_4_ = 0xc0400000;
      auVar250._20_4_ = 0xc0400000;
      auVar250._24_4_ = 0xc0400000;
      auVar250._28_4_ = 0xc0400000;
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar196 = vrsqrtps_avx(*pauVar23);
            *pauVar23 = auVar196;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar152 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar23);
          *(undefined1 (*) [16])*pauVar23 = auVar152;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar289._8_8_ = 0;
          auVar289._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar289,0x44);
          auVar152 = vorps_avx(auVar257,auVar158);
          auVar127 = vorps_avx(auVar257,auVar158);
          auVar257 = vorps_avx(auVar257,auVar158);
          uVar25 = 0;
          do {
            auVar370._8_8_ = 0;
            auVar370._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar370,0x44);
            auVar385._16_16_ = auVar342;
            auVar385._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar385,auVar139);
            auVar270 = vorps_avx(auVar385,auVar51);
            auVar417._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar417._8_4_ = auVar270._24_4_;
            auVar417._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar417,auVar152);
            auVar371._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar371._8_4_ = auVar270._8_4_;
            auVar371._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar371,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar418._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar418._8_4_ = auVar196._24_4_;
            auVar418._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar418,auVar152);
            auVar398._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar398._8_4_ = auVar196._8_4_;
            auVar398._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar398,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar368 ^ auVar29,auVar342 ^ auVar29);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar386._16_16_ = auVar342;
            auVar386._0_16_ = auVar368;
            auVar270 = vmaskmovps_avx(auVar386,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar196 = vrsqrtps_avx(auVar270);
            auVar15._4_4_ = auVar270._4_4_ * auVar196._4_4_;
            auVar15._0_4_ = auVar270._0_4_ * auVar196._0_4_;
            auVar15._8_4_ = auVar270._8_4_ * auVar196._8_4_;
            auVar15._12_4_ = auVar270._12_4_ * auVar196._12_4_;
            auVar15._16_4_ = auVar270._16_4_ * auVar196._16_4_;
            auVar15._20_4_ = auVar270._20_4_ * auVar196._20_4_;
            auVar15._24_4_ = auVar270._24_4_ * auVar196._24_4_;
            auVar15._28_4_ = auVar270._28_4_;
            auVar342 = vfmadd213ps_fma(auVar15,auVar196,auVar250);
            auVar404._0_4_ = auVar196._0_4_ * -0.5 * auVar342._0_4_;
            auVar404._4_4_ = auVar196._4_4_ * -0.5 * auVar342._4_4_;
            auVar404._8_4_ = auVar196._8_4_ * -0.5 * auVar342._8_4_;
            auVar404._12_4_ = auVar196._12_4_ * -0.5 * auVar342._12_4_;
            auVar404._16_4_ = auVar196._16_4_ * -0.5 * 0.0;
            auVar404._20_4_ = auVar196._20_4_ * -0.5 * 0.0;
            auVar404._24_4_ = auVar196._24_4_ * -0.5 * 0.0;
            auVar404._28_4_ = 0;
            auVar196 = vmaskmovps_avx(auVar386,auVar404);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 7:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar26) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar483._8_4_ = 0x3e2aaaaa;
        auVar483._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar422._8_4_ = 0x395e8083;
        auVar422._0_8_ = 0x395e8083395e8083;
        auVar381._8_4_ = 0x3f318000;
        auVar381._0_8_ = 0x3f3180003f318000;
        auVar348._8_4_ = 0x3f800000;
        auVar348._0_8_ = 0x3f8000003f800000;
        auVar329._8_4_ = 0x3d2aa9c1;
        auVar329._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar297._8_4_ = 0x3f000000;
        auVar297._0_8_ = 0x3f0000003f000000;
        auVar269._8_4_ = 0x3c088908;
        auVar269._0_8_ = 0x3c0889083c088908;
        auVar241._8_4_ = 0x39506967;
        auVar241._0_8_ = 0x3950696739506967;
        auVar195._8_4_ = 0x3fb8aa3b;
        auVar195._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar165._8_4_ = 0xc2b0c0a5;
        auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar138._8_4_ = 0x42b0c0a5;
        auVar138._0_8_ = 0x42b0c0a542b0c0a5;
        auVar483._12_4_ = 0x3e2aaaaa;
        auVar422._12_4_ = 0x395e8083;
        auVar381._12_4_ = 0x3f318000;
        auVar348._12_4_ = 0x3f800000;
        auVar329._12_4_ = 0x3d2aa9c1;
        auVar297._12_4_ = 0x3f000000;
        auVar269._12_4_ = 0x3c088908;
        auVar241._12_4_ = 0x39506967;
        auVar195._12_4_ = 0x3fb8aa3b;
        auVar165._12_4_ = 0xc2b0c0a5;
        auVar138._12_4_ = 0x42b0c0a5;
        auVar483._16_4_ = 0x3e2aaaaa;
        auVar422._16_4_ = 0x395e8083;
        auVar381._16_4_ = 0x3f318000;
        auVar348._16_4_ = 0x3f800000;
        auVar329._16_4_ = 0x3d2aa9c1;
        auVar297._16_4_ = 0x3f000000;
        auVar269._16_4_ = 0x3c088908;
        auVar241._16_4_ = 0x39506967;
        auVar195._16_4_ = 0x3fb8aa3b;
        auVar165._16_4_ = 0xc2b0c0a5;
        auVar138._16_4_ = 0x42b0c0a5;
        auVar483._20_4_ = 0x3e2aaaaa;
        auVar422._20_4_ = 0x395e8083;
        auVar381._20_4_ = 0x3f318000;
        auVar348._20_4_ = 0x3f800000;
        auVar329._20_4_ = 0x3d2aa9c1;
        auVar297._20_4_ = 0x3f000000;
        auVar269._20_4_ = 0x3c088908;
        auVar241._20_4_ = 0x39506967;
        auVar195._20_4_ = 0x3fb8aa3b;
        auVar165._20_4_ = 0xc2b0c0a5;
        auVar138._20_4_ = 0x42b0c0a5;
        auVar483._24_4_ = 0x3e2aaaaa;
        auVar422._24_4_ = 0x395e8083;
        auVar381._24_4_ = 0x3f318000;
        auVar348._24_4_ = 0x3f800000;
        auVar329._24_4_ = 0x3d2aa9c1;
        auVar297._24_4_ = 0x3f000000;
        auVar269._24_4_ = 0x3c088908;
        auVar241._24_4_ = 0x39506967;
        auVar195._24_4_ = 0x3fb8aa3b;
        auVar165._24_4_ = 0xc2b0c0a5;
        auVar138._24_4_ = 0x42b0c0a5;
        auVar483._28_4_ = 0x3e2aaaaa;
        auVar422._28_4_ = 0x395e8083;
        auVar381._28_4_ = 0x3f318000;
        auVar348._28_4_ = 0x3f800000;
        auVar329._28_4_ = 0x3d2aa9c1;
        auVar297._28_4_ = 0x3f000000;
        auVar269._28_4_ = 0x3c088908;
        auVar241._28_4_ = 0x39506967;
        auVar195._28_4_ = 0x3fb8aa3b;
        auVar165._28_4_ = 0xc2b0c0a5;
        auVar138._28_4_ = 0x42b0c0a5;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar139 = vminps_avx(auVar138,*pauVar23);
            auVar51 = vmaxps_avx(auVar139,auVar165);
            auVar29 = vfmadd213ps_fma(auVar195,auVar51,auVar297);
            auVar196 = vroundps_avx(ZEXT1632(auVar29),1);
            auVar139 = vcmpps_avx(ZEXT1632(auVar29),auVar196,1);
            auVar139 = vandps_avx(auVar348,auVar139);
            auVar139 = vsubps_avx(auVar196,auVar139);
            auVar29 = vfmsub231ps_fma(auVar51,auVar139,auVar381);
            auVar152 = vfmsub231ps_fma(ZEXT1632(auVar29),auVar139,auVar422);
            auVar51 = ZEXT1632(auVar152);
            auVar10._28_4_ = auVar196._28_4_;
            auVar10._0_28_ =
                 ZEXT1628(CONCAT412(auVar152._12_4_ * auVar152._12_4_,
                                    CONCAT48(auVar152._8_4_ * auVar152._8_4_,
                                             CONCAT44(auVar152._4_4_ * auVar152._4_4_,
                                                      auVar152._0_4_ * auVar152._0_4_))));
            auVar242._8_4_ = 0x3ab743ce;
            auVar242._0_8_ = 0x3ab743ce3ab743ce;
            auVar242._12_4_ = 0x3ab743ce;
            auVar242._16_4_ = 0x3ab743ce;
            auVar242._20_4_ = 0x3ab743ce;
            auVar242._24_4_ = 0x3ab743ce;
            auVar242._28_4_ = 0x3ab743ce;
            auVar29 = vfmadd213ps_fma(auVar241,auVar51,auVar242);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar269);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar329);
            auVar51 = ZEXT1632(auVar152);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar483);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar297);
            auVar127 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar10,auVar51);
            auVar36._0_4_ = (int)auVar139._0_4_;
            auVar36._4_4_ = (int)auVar139._4_4_;
            auVar36._8_4_ = (int)auVar139._8_4_;
            auVar36._12_4_ = (int)auVar139._12_4_;
            auVar60._16_4_ = (int)auVar139._16_4_;
            auVar60._0_16_ = auVar36;
            auVar60._20_4_ = (int)auVar139._20_4_;
            auVar60._24_4_ = (int)auVar139._24_4_;
            auVar60._28_4_ = (int)auVar139._28_4_;
            auVar152 = vpslld_avx(auVar36,0x17);
            auVar29 = vpslld_avx(auVar60._16_16_,0x17);
            auVar222._8_4_ = 0x3f800000;
            auVar222._0_8_ = 0x3f8000003f800000;
            auVar222._12_4_ = 0x3f800000;
            auVar29 = vpaddd_avx(auVar29,auVar222);
            auVar152 = vpaddd_avx(auVar152,auVar222);
            auVar61._16_16_ = auVar29;
            auVar61._0_16_ = auVar152;
            auVar29 = vfmadd213ps_fma(auVar61,ZEXT1632(auVar127),auVar61);
            *pauVar23 = ZEXT1632(auVar29);
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar26);
          uVar24 = (uint)local_130;
        }
        auVar223._8_4_ = 0x3f800000;
        auVar223._0_8_ = 0x3f8000003f800000;
        auVar223._12_4_ = 0x3f800000;
        auVar261._8_4_ = 0x42b0c0a5;
        auVar261._0_8_ = 0x42b0c0a542b0c0a5;
        auVar261._12_4_ = 0x42b0c0a5;
        auVar282._8_4_ = 0xc2b0c0a5;
        auVar282._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar282._12_4_ = 0xc2b0c0a5;
        auVar313._8_4_ = 0x3fb8aa3b;
        auVar313._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar313._12_4_ = 0x3fb8aa3b;
        auVar341._8_4_ = 0x3f000000;
        auVar341._0_8_ = 0x3f0000003f000000;
        auVar341._12_4_ = 0x3f000000;
        auVar365._8_4_ = 0x3f318000;
        auVar365._0_8_ = 0x3f3180003f318000;
        auVar365._12_4_ = 0x3f318000;
        auVar394._8_4_ = 0x395e8083;
        auVar394._0_8_ = 0x395e8083395e8083;
        auVar394._12_4_ = 0x395e8083;
        auVar413._8_4_ = 0x3ab743ce;
        auVar413._0_8_ = 0x3ab743ce3ab743ce;
        auVar413._12_4_ = 0x3ab743ce;
        auVar428._8_4_ = 0x39506967;
        auVar428._0_8_ = 0x3950696739506967;
        auVar428._12_4_ = 0x39506967;
        auVar443._8_4_ = 0x3c088908;
        auVar443._0_8_ = 0x3c0889083c088908;
        auVar443._12_4_ = 0x3c088908;
        auVar460._8_4_ = 0x3d2aa9c1;
        auVar460._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar460._12_4_ = 0x3d2aa9c1;
        auVar473._8_4_ = 0x3e2aaaaa;
        auVar473._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar473._12_4_ = 0x3e2aaaaa;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar26) {
          auVar29 = vminps_avx(auVar261,*(undefined1 (*) [16])*pauVar23);
          auVar127 = vmaxps_avx(auVar29,auVar282);
          auVar29 = vfmadd213ps_fma(auVar313,auVar127,auVar341);
          auVar150._0_4_ = (int)auVar29._0_4_;
          auVar150._4_4_ = (int)auVar29._4_4_;
          auVar150._8_4_ = (int)auVar29._8_4_;
          auVar150._12_4_ = (int)auVar29._12_4_;
          auVar152 = vcvtdq2ps_avx(auVar150);
          auVar29 = vcmpps_avx(auVar29,auVar152,1);
          auVar29 = vandps_avx(auVar29,auVar223);
          auVar29 = vsubps_avx(auVar152,auVar29);
          auVar152 = vfmsub231ps_fma(auVar127,auVar29,auVar365);
          auVar127 = vfmsub231ps_fma(auVar152,auVar29,auVar394);
          auVar151._0_4_ = auVar127._0_4_ * auVar127._0_4_;
          auVar151._4_4_ = auVar127._4_4_ * auVar127._4_4_;
          auVar151._8_4_ = auVar127._8_4_ * auVar127._8_4_;
          auVar151._12_4_ = auVar127._12_4_ * auVar127._12_4_;
          auVar152 = vfmadd213ps_fma(auVar428,auVar127,auVar413);
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar443);
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar460);
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar473);
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar341);
          auVar152 = vfmadd213ps_fma(auVar152,auVar151,auVar127);
          auVar37._0_4_ = (int)auVar29._0_4_;
          auVar37._4_4_ = (int)auVar29._4_4_;
          auVar37._8_4_ = (int)auVar29._8_4_;
          auVar37._12_4_ = (int)auVar29._12_4_;
          auVar29 = vpslld_avx(auVar37,0x17);
          auVar29 = vpaddd_avx(auVar29,auVar223);
          auVar29 = vfmadd213ps_fma(auVar29,auVar152,auVar29);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar261,auVar261);
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar17;
          local_a0._0_16_ = vpshufd_avx(auVar38,0x44);
          local_d0 = vorps_avx(local_a0._0_16_,local_f0);
          local_e0 = vorps_avx(local_a0._0_16_,local_f0);
          uVar25 = 0;
          auVar139 = _DAT_00595120;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar25;
            auVar152 = vpshufd_avx(auVar39,0x44);
            auVar62._16_16_ = auVar152;
            auVar62._0_16_ = auVar152;
            auVar51 = vorps_avx(auVar62,_DAT_00595100);
            auVar139 = vorps_avx(auVar62,auVar139);
            auVar257 = vpor_avx(local_a0._16_16_,local_f0);
            auVar152 = vpcmpgtq_avx(auVar139._16_16_ ^ local_f0,auVar257);
            auVar127 = vpcmpgtq_avx(auVar139._0_16_ ^ local_f0,local_d0);
            auVar152 = vpackssdw_avx(auVar127,auVar152);
            auVar127 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar257);
            auVar126._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar126._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar126._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar126._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar257 = vpcmpgtq_avx(auVar126,local_e0);
            auVar127 = vpackssdw_avx(auVar257,auVar127);
            auVar152 = vpackssdw_avx(auVar127 ^ auVar29,auVar152 ^ auVar29);
            auVar127 = vpmovsxwd_avx(auVar152);
            auVar152 = vpunpckhwd_avx(auVar152,auVar152);
            local_c0._16_16_ = auVar152;
            local_c0._0_16_ = auVar127;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = expf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_03;
            local_160._8_4_ = extraout_XMM0_Dc_03;
            local_160._12_4_ = extraout_XMM0_Dd_03;
            auVar152 = vmovshdup_avx(local_150);
            auVar89._0_4_ = expf(auVar152._0_4_);
            auVar89._4_60_ = extraout_var_11;
            local_160 = vinsertps_avx(local_160,auVar89._0_16_,0x10);
            auVar152 = vpermilpd_avx(local_150,1);
            auVar90._0_4_ = expf(auVar152._0_4_);
            auVar90._4_60_ = extraout_var_12;
            local_160 = vinsertps_avx(local_160,auVar90._0_16_,0x20);
            auVar152 = vpermilps_avx(local_150,0xff);
            auVar91._0_4_ = expf(auVar152._0_4_);
            auVar91._4_60_ = extraout_var_13;
            local_150 = vinsertps_avx(local_160,auVar91._0_16_,0x30);
            local_160._0_4_ = expf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_04;
            local_160._8_4_ = extraout_XMM0_Dc_04;
            local_160._12_4_ = extraout_XMM0_Dd_04;
            auVar152 = vmovshdup_avx(local_120._0_16_);
            auVar92._0_4_ = expf(auVar152._0_4_);
            auVar92._4_60_ = extraout_var_14;
            local_160 = vinsertps_avx(local_160,auVar92._0_16_,0x10);
            auVar152 = vpermilpd_avx(local_120._0_16_,1);
            auVar93._0_4_ = expf(auVar152._0_4_);
            auVar93._4_60_ = extraout_var_15;
            local_160 = vinsertps_avx(local_160,auVar93._0_16_,0x20);
            auVar152 = vpermilps_avx(local_120._0_16_,0xff);
            auVar94._0_4_ = expf(auVar152._0_4_);
            auVar139 = _DAT_00595120;
            auVar94._4_60_ = extraout_var_16;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            auVar152 = vinsertps_avx(local_160,auVar94._0_16_,0x30);
            auVar63._16_16_ = local_150;
            auVar63._0_16_ = auVar152;
            auVar51 = vmaskmovps_avx(local_c0,auVar63);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
    break;
  case 8:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar26) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar486._8_4_ = 0x3e11e9bf;
        auVar486._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar467._8_4_ = 0xbdfe5d4f;
        auVar467._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar455._8_4_ = 0x3def251a;
        auVar455._0_8_ = 0x3def251a3def251a;
        auVar438._8_4_ = 0x3d9021bb;
        auVar438._0_8_ = 0x3d9021bb3d9021bb;
        auVar425._8_4_ = 0xbdebd1b8;
        auVar425._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar387._8_4_ = 0x3f3504f3;
        auVar387._0_8_ = 0x3f3504f33f3504f3;
        auVar333._8_4_ = 0x3f000000;
        auVar333._0_8_ = 0x3f0000003f000000;
        auVar300._8_4_ = 0x807fffff;
        auVar300._0_8_ = 0x807fffff807fffff;
        auVar271._8_4_ = 0x800000;
        auVar271._0_8_ = 0x80000000800000;
        auVar486._12_4_ = 0x3e11e9bf;
        auVar467._12_4_ = 0xbdfe5d4f;
        auVar455._12_4_ = 0x3def251a;
        auVar438._12_4_ = 0x3d9021bb;
        auVar425._12_4_ = 0xbdebd1b8;
        auVar387._12_4_ = 0x3f3504f3;
        auVar333._12_4_ = 0x3f000000;
        auVar300._12_4_ = 0x807fffff;
        auVar271._12_4_ = 0x800000;
        auVar486._16_4_ = 0x3e11e9bf;
        auVar467._16_4_ = 0xbdfe5d4f;
        auVar455._16_4_ = 0x3def251a;
        auVar438._16_4_ = 0x3d9021bb;
        auVar425._16_4_ = 0xbdebd1b8;
        auVar387._16_4_ = 0x3f3504f3;
        auVar333._16_4_ = 0x3f000000;
        auVar300._16_4_ = 0x807fffff;
        auVar271._16_4_ = 0x800000;
        auVar486._20_4_ = 0x3e11e9bf;
        auVar467._20_4_ = 0xbdfe5d4f;
        auVar455._20_4_ = 0x3def251a;
        auVar438._20_4_ = 0x3d9021bb;
        auVar425._20_4_ = 0xbdebd1b8;
        auVar387._20_4_ = 0x3f3504f3;
        auVar333._20_4_ = 0x3f000000;
        auVar300._20_4_ = 0x807fffff;
        auVar271._20_4_ = 0x800000;
        auVar345._8_4_ = 0xffffff81;
        auVar345._0_8_ = 0xffffff81ffffff81;
        auVar486._24_4_ = 0x3e11e9bf;
        auVar467._24_4_ = 0xbdfe5d4f;
        auVar455._24_4_ = 0x3def251a;
        auVar438._24_4_ = 0x3d9021bb;
        auVar425._24_4_ = 0xbdebd1b8;
        auVar387._24_4_ = 0x3f3504f3;
        auVar333._24_4_ = 0x3f000000;
        auVar300._24_4_ = 0x807fffff;
        auVar271._24_4_ = 0x800000;
        auVar486._28_4_ = 0x3e11e9bf;
        auVar467._28_4_ = 0xbdfe5d4f;
        auVar455._28_4_ = 0x3def251a;
        auVar438._28_4_ = 0x3d9021bb;
        auVar425._28_4_ = 0xbdebd1b8;
        auVar387._28_4_ = 0x3f3504f3;
        auVar345._12_4_ = 0xffffff81;
        auVar333._28_4_ = 0x3f000000;
        auVar300._28_4_ = 0x807fffff;
        auVar271._28_4_ = 0x800000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar139 = vmaxps_avx(auVar271,*pauVar23);
            auVar152 = vpsrld_avx(auVar139._0_16_,0x17);
            auVar29 = vpsrld_avx(auVar139._16_16_,0x17);
            auVar139 = vandps_avx(auVar139,auVar300);
            auVar196 = vorps_avx(auVar139,auVar333);
            auVar51 = vcmpps_avx(auVar387,auVar196,2);
            auVar139 = vandnps_avx(auVar51,auVar196);
            auVar71._0_4_ = auVar196._0_4_ + -1.0 + auVar139._0_4_;
            auVar71._4_4_ = auVar196._4_4_ + -1.0 + auVar139._4_4_;
            auVar71._8_4_ = auVar196._8_4_ + -1.0 + auVar139._8_4_;
            auVar71._12_4_ = auVar196._12_4_ + -1.0 + auVar139._12_4_;
            auVar71._16_4_ = auVar196._16_4_ + -1.0 + auVar139._16_4_;
            auVar71._20_4_ = auVar196._20_4_ + -1.0 + auVar139._20_4_;
            auVar71._24_4_ = auVar196._24_4_ + -1.0 + auVar139._24_4_;
            auVar71._28_4_ = auVar196._28_4_ + -1.0 + auVar139._28_4_;
            auVar29 = vpsubd_avx(auVar29,auVar51._16_16_);
            auVar29 = vpaddd_avx(auVar345,auVar29);
            auVar152 = vpsubd_avx(auVar152,auVar51._0_16_);
            auVar152 = vpaddd_avx(auVar345,auVar152);
            auVar142._16_16_ = auVar29;
            auVar142._0_16_ = auVar152;
            auVar171._0_4_ = auVar71._0_4_ * auVar71._0_4_;
            auVar171._4_4_ = auVar71._4_4_ * auVar71._4_4_;
            auVar171._8_4_ = auVar71._8_4_ * auVar71._8_4_;
            auVar171._12_4_ = auVar71._12_4_ * auVar71._12_4_;
            auVar171._16_4_ = auVar71._16_4_ * auVar71._16_4_;
            auVar171._20_4_ = auVar71._20_4_ * auVar71._20_4_;
            auVar171._24_4_ = auVar71._24_4_ * auVar71._24_4_;
            auVar171._28_4_ = 0;
            auVar29 = vfmadd213ps_fma(auVar438,auVar71,auVar425);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71,auVar455);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71,auVar467);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71,auVar486);
            auVar251._8_4_ = 0xbe2aae50;
            auVar251._0_8_ = 0xbe2aae50be2aae50;
            auVar251._12_4_ = 0xbe2aae50;
            auVar251._16_4_ = 0xbe2aae50;
            auVar251._20_4_ = 0xbe2aae50;
            auVar251._24_4_ = 0xbe2aae50;
            auVar251._28_4_ = 0xbe2aae50;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71,auVar251);
            auVar252._8_4_ = 0x3e4cceac;
            auVar252._0_8_ = 0x3e4cceac3e4cceac;
            auVar252._12_4_ = 0x3e4cceac;
            auVar252._16_4_ = 0x3e4cceac;
            auVar252._20_4_ = 0x3e4cceac;
            auVar252._24_4_ = 0x3e4cceac;
            auVar252._28_4_ = 0x3e4cceac;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71,auVar252);
            auVar253._8_4_ = 0xbe7ffffc;
            auVar253._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar253._12_4_ = 0xbe7ffffc;
            auVar253._16_4_ = 0xbe7ffffc;
            auVar253._20_4_ = 0xbe7ffffc;
            auVar253._24_4_ = 0xbe7ffffc;
            auVar253._28_4_ = 0xbe7ffffc;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71,auVar253);
            auVar254._8_4_ = 0x3eaaaaaa;
            auVar254._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar254._12_4_ = 0x3eaaaaaa;
            auVar254._16_4_ = 0x3eaaaaaa;
            auVar254._20_4_ = 0x3eaaaaaa;
            auVar254._24_4_ = 0x3eaaaaaa;
            auVar254._28_4_ = 0x3eaaaaaa;
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar71,auVar254);
            auVar200._0_4_ = auVar171._0_4_ * auVar71._0_4_ * auVar29._0_4_;
            auVar200._4_4_ = auVar171._4_4_ * auVar71._4_4_ * auVar29._4_4_;
            auVar200._8_4_ = auVar171._8_4_ * auVar71._8_4_ * auVar29._8_4_;
            auVar200._12_4_ = auVar171._12_4_ * auVar71._12_4_ * auVar29._12_4_;
            auVar200._16_4_ = auVar171._16_4_ * auVar71._16_4_ * 0.0;
            auVar200._20_4_ = auVar171._20_4_ * auVar71._20_4_ * 0.0;
            auVar200._24_4_ = auVar171._24_4_ * auVar71._24_4_ * 0.0;
            auVar200._28_4_ = 0;
            auVar139 = vcvtdq2ps_avx(auVar142);
            auVar255._8_4_ = 0xb95e8083;
            auVar255._0_8_ = 0xb95e8083b95e8083;
            auVar255._12_4_ = 0xb95e8083;
            auVar255._16_4_ = 0xb95e8083;
            auVar255._20_4_ = 0xb95e8083;
            auVar255._24_4_ = 0xb95e8083;
            auVar255._28_4_ = 0xb95e8083;
            auVar29 = vfmadd231ps_fma(auVar200,auVar139,auVar255);
            auVar29 = vfmsub231ps_fma(ZEXT1632(auVar29),auVar333,auVar171);
            auVar51 = vsubps_avx(ZEXT1632(auVar29),auVar71);
            auVar172._8_4_ = 0x3f318000;
            auVar172._0_8_ = 0x3f3180003f318000;
            auVar172._12_4_ = 0x3f318000;
            auVar172._16_4_ = 0x3f318000;
            auVar172._20_4_ = 0x3f318000;
            auVar172._24_4_ = 0x3f318000;
            auVar172._28_4_ = 0x3f318000;
            auVar29 = vfmsub231ps_fma(auVar51,auVar172,auVar139);
            *pauVar23 = ZEXT1632(auVar29);
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar26);
          uVar24 = (uint)local_130;
        }
        auVar267._8_4_ = 0x800000;
        auVar267._0_8_ = 0x80000000800000;
        auVar267._12_4_ = 0x800000;
        auVar316._8_4_ = 0x3f000000;
        auVar316._0_8_ = 0x3f0000003f000000;
        auVar316._12_4_ = 0x3f000000;
        auVar346._8_4_ = 0xffffff82;
        auVar346._0_8_ = 0xffffff82ffffff82;
        auVar346._12_4_ = 0xffffff82;
        auVar373._8_4_ = 0x3f3504f3;
        auVar373._0_8_ = 0x3f3504f33f3504f3;
        auVar373._12_4_ = 0x3f3504f3;
        auVar420._8_4_ = 0x3f800000;
        auVar420._0_8_ = 0x3f8000003f800000;
        auVar420._12_4_ = 0x3f800000;
        auVar433._8_4_ = 0xbdebd1b8;
        auVar433._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar433._12_4_ = 0xbdebd1b8;
        auVar448._8_4_ = 0x3d9021bb;
        auVar448._0_8_ = 0x3d9021bb3d9021bb;
        auVar448._12_4_ = 0x3d9021bb;
        auVar464._8_4_ = 0x3def251a;
        auVar464._0_8_ = 0x3def251a3def251a;
        auVar464._12_4_ = 0x3def251a;
        auVar481._8_4_ = 0xbdfe5d4f;
        auVar481._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar481._12_4_ = 0xbdfe5d4f;
        auVar291._8_4_ = 0x3e11e9bf;
        auVar291._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar291._12_4_ = 0x3e11e9bf;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar26) {
          auVar29 = vmaxps_avx(auVar267,*(undefined1 (*) [16])*pauVar23);
          auVar152 = vpsrld_avx(auVar29,0x17);
          auVar152 = vpaddd_avx(auVar346,auVar152);
          auVar161._8_4_ = 0x807fffff;
          auVar161._0_8_ = 0x807fffff807fffff;
          auVar161._12_4_ = 0x807fffff;
          auVar29 = vandps_avx(auVar29,auVar161);
          auVar257 = vorps_avx(auVar29,auVar316);
          auVar127 = vcvtdq2ps_avx(auVar152);
          auVar152 = vcmpps_avx(auVar257,auVar373,1);
          auVar29 = vandps_avx(auVar152,auVar257);
          auVar46._0_4_ = auVar257._0_4_ + -1.0 + auVar29._0_4_;
          auVar46._4_4_ = auVar257._4_4_ + -1.0 + auVar29._4_4_;
          auVar46._8_4_ = auVar257._8_4_ + -1.0 + auVar29._8_4_;
          auVar46._12_4_ = auVar257._12_4_ + -1.0 + auVar29._12_4_;
          auVar29 = vandps_avx(auVar420,auVar152);
          auVar29 = vsubps_avx(auVar127,auVar29);
          auVar162._0_4_ = auVar46._0_4_ * auVar46._0_4_;
          auVar162._4_4_ = auVar46._4_4_ * auVar46._4_4_;
          auVar162._8_4_ = auVar46._8_4_ * auVar46._8_4_;
          auVar162._12_4_ = auVar46._12_4_ * auVar46._12_4_;
          auVar152 = vfmadd213ps_fma(auVar448,auVar46,auVar433);
          auVar152 = vfmadd213ps_fma(auVar152,auVar46,auVar464);
          auVar152 = vfmadd213ps_fma(auVar152,auVar46,auVar481);
          auVar152 = vfmadd213ps_fma(auVar152,auVar46,auVar291);
          auVar235._8_4_ = 0xbe2aae50;
          auVar235._0_8_ = 0xbe2aae50be2aae50;
          auVar235._12_4_ = 0xbe2aae50;
          auVar152 = vfmadd213ps_fma(auVar152,auVar46,auVar235);
          auVar236._8_4_ = 0x3e4cceac;
          auVar236._0_8_ = 0x3e4cceac3e4cceac;
          auVar236._12_4_ = 0x3e4cceac;
          auVar152 = vfmadd213ps_fma(auVar152,auVar46,auVar236);
          auVar237._8_4_ = 0xbe7ffffc;
          auVar237._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar237._12_4_ = 0xbe7ffffc;
          auVar152 = vfmadd213ps_fma(auVar152,auVar46,auVar237);
          auVar238._8_4_ = 0x3eaaaaaa;
          auVar238._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar238._12_4_ = 0x3eaaaaaa;
          auVar152 = vfmadd213ps_fma(auVar152,auVar46,auVar238);
          auVar190._0_4_ = auVar162._0_4_ * auVar46._0_4_ * auVar152._0_4_;
          auVar190._4_4_ = auVar162._4_4_ * auVar46._4_4_ * auVar152._4_4_;
          auVar190._8_4_ = auVar162._8_4_ * auVar46._8_4_ * auVar152._8_4_;
          auVar190._12_4_ = auVar162._12_4_ * auVar46._12_4_ * auVar152._12_4_;
          auVar239._8_4_ = 0xb95e8083;
          auVar239._0_8_ = 0xb95e8083b95e8083;
          auVar239._12_4_ = 0xb95e8083;
          auVar152 = vfmadd231ps_fma(auVar190,auVar29,auVar239);
          auVar152 = vfmsub231ps_fma(auVar152,auVar316,auVar162);
          auVar152 = vsubps_avx(auVar152,auVar46);
          auVar163._8_4_ = 0x3f318000;
          auVar163._0_8_ = 0x3f3180003f318000;
          auVar163._12_4_ = 0x3f318000;
          auVar29 = vfmsub231ps_fma(auVar152,auVar163,auVar29);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar267,auVar267);
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar17;
          local_a0._0_16_ = vpshufd_avx(auVar47,0x44);
          local_d0 = vpor_avx(local_a0._0_16_,local_f0);
          local_e0 = vpor_avx(local_a0._0_16_,local_f0);
          uVar25 = 0;
          auVar139 = _DAT_00595120;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar25;
            auVar152 = vpshufd_avx(auVar48,0x44);
            auVar72._16_16_ = auVar152;
            auVar72._0_16_ = auVar152;
            auVar51 = vorps_avx(auVar72,_DAT_00595100);
            auVar139 = vorps_avx(auVar72,auVar139);
            auVar257 = vpor_avx(local_a0._16_16_,local_f0);
            auVar152 = vpcmpgtq_avx(auVar139._16_16_ ^ local_f0,auVar257);
            auVar127 = vpcmpgtq_avx(auVar139._0_16_ ^ local_f0,local_d0);
            auVar152 = vpackssdw_avx(auVar127,auVar152);
            auVar127 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar257);
            auVar133._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar133._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar133._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar133._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar257 = vpcmpgtq_avx(auVar133,local_e0);
            auVar127 = vpackssdw_avx(auVar257,auVar127);
            auVar152 = vpackssdw_avx(auVar127 ^ auVar29,auVar152 ^ auVar29);
            auVar127 = vpmovsxwd_avx(auVar152);
            auVar152 = vpunpckhwd_avx(auVar152,auVar152);
            local_c0._16_16_ = auVar152;
            local_c0._0_16_ = auVar127;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = logf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_09;
            local_160._8_4_ = extraout_XMM0_Dc_09;
            local_160._12_4_ = extraout_XMM0_Dd_09;
            auVar152 = vmovshdup_avx(local_150);
            auVar106._0_4_ = logf(auVar152._0_4_);
            auVar106._4_60_ = extraout_var_29;
            local_160 = vinsertps_avx(local_160,auVar106._0_16_,0x10);
            auVar152 = vpermilpd_avx(local_150,1);
            auVar107._0_4_ = logf(auVar152._0_4_);
            auVar107._4_60_ = extraout_var_30;
            local_160 = vinsertps_avx(local_160,auVar107._0_16_,0x20);
            auVar152 = vpermilps_avx(local_150,0xff);
            auVar108._0_4_ = logf(auVar152._0_4_);
            auVar108._4_60_ = extraout_var_31;
            local_150 = vinsertps_avx(local_160,auVar108._0_16_,0x30);
            local_160._0_4_ = logf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_10;
            local_160._8_4_ = extraout_XMM0_Dc_10;
            local_160._12_4_ = extraout_XMM0_Dd_10;
            auVar152 = vmovshdup_avx(local_120._0_16_);
            auVar109._0_4_ = logf(auVar152._0_4_);
            auVar109._4_60_ = extraout_var_32;
            local_160 = vinsertps_avx(local_160,auVar109._0_16_,0x10);
            auVar152 = vpermilpd_avx(local_120._0_16_,1);
            auVar110._0_4_ = logf(auVar152._0_4_);
            auVar110._4_60_ = extraout_var_33;
            local_160 = vinsertps_avx(local_160,auVar110._0_16_,0x20);
            auVar152 = vpermilps_avx(local_120._0_16_,0xff);
            auVar111._0_4_ = logf(auVar152._0_4_);
            auVar139 = _DAT_00595120;
            auVar111._4_60_ = extraout_var_34;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            auVar152 = vinsertps_avx(local_160,auVar111._0_16_,0x30);
            auVar73._16_16_ = local_150;
            auVar73._0_16_ = auVar152;
            auVar51 = vmaskmovps_avx(local_c0,auVar73);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
    break;
  case 9:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar29 = in_ZMM8._0_16_;
        pfVar21 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          uVar19 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar21;
            UnaryOp_x86_fma_functor::unary_op_sin::func_pack8
                      ((unary_op_sin *)&local_161,(__m256 *)local_80);
            auVar29 = in_ZMM8._0_16_;
            *(undefined1 (*) [32])pfVar21 = local_80;
            pfVar21 = pfVar21 + 8;
            uVar24 = uVar19 + 8;
            iVar16 = uVar19 + 0xf;
            uVar19 = uVar24;
          } while (iVar16 < iVar26);
        }
        uVar19 = uVar24 | 3;
        auVar29 = vpcmpeqd_avx(auVar29,auVar29);
        in_ZMM8 = ZEXT1664(auVar29);
        auVar392._8_4_ = 2;
        auVar392._0_8_ = 0x200000002;
        auVar392._12_4_ = 2;
        auVar442._8_4_ = 0xbf490000;
        auVar442._0_8_ = 0xbf490000bf490000;
        auVar442._12_4_ = 0xbf490000;
        auVar459._8_4_ = 0xb97da000;
        auVar459._0_8_ = 0xb97da000b97da000;
        auVar459._12_4_ = 0xb97da000;
        auVar472._8_4_ = 0xb3222169;
        auVar472._0_8_ = 0xb3222169b3222169;
        auVar472._12_4_ = 0xb3222169;
        auVar308._8_4_ = 0x37ccf5ce;
        auVar308._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar308._12_4_ = 0x37ccf5ce;
        auVar410._8_4_ = 0x3d2aaaa5;
        auVar410._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar410._12_4_ = 0x3d2aaaa5;
        auVar358._8_4_ = 0x3f000000;
        auVar358._0_8_ = 0x3f0000003f000000;
        auVar358._12_4_ = 0x3f000000;
        while ((int)uVar19 < iVar26) {
          auVar121._8_4_ = 0x7fffffff;
          auVar121._0_8_ = 0x7fffffff7fffffff;
          auVar121._12_4_ = 0x7fffffff;
          auVar152 = vandps_avx(*(undefined1 (*) [16])pfVar21,auVar121);
          auVar122._0_4_ = (int)(auVar152._0_4_ * 1.2732395);
          auVar122._4_4_ = (int)(auVar152._4_4_ * 1.2732395);
          auVar122._8_4_ = (int)(auVar152._8_4_ * 1.2732395);
          auVar122._12_4_ = (int)(auVar152._12_4_ * 1.2732395);
          auVar257 = vpsubd_avx(auVar122,auVar29);
          auVar181._8_4_ = 0xfffffffe;
          auVar181._0_8_ = 0xfffffffefffffffe;
          auVar181._12_4_ = 0xfffffffe;
          auVar127 = vpand_avx(auVar257,auVar181);
          auVar127 = vcvtdq2ps_avx(auVar127);
          auVar152 = vfmadd231ps_fma(auVar152,auVar127,auVar442);
          auVar152 = vfmadd231ps_fma(auVar152,auVar127,auVar459);
          auVar127 = vfmadd231ps_fma(auVar152,auVar472,auVar127);
          auVar182._0_4_ = auVar127._0_4_ * auVar127._0_4_;
          auVar182._4_4_ = auVar127._4_4_ * auVar127._4_4_;
          auVar182._8_4_ = auVar127._8_4_ * auVar127._8_4_;
          auVar182._12_4_ = auVar127._12_4_ * auVar127._12_4_;
          auVar259._8_4_ = 0xbab6061a;
          auVar259._0_8_ = 0xbab6061abab6061a;
          auVar259._12_4_ = 0xbab6061a;
          auVar152 = vfmadd213ps_fma(auVar308,auVar182,auVar259);
          auVar152 = vfmadd213ps_fma(auVar152,auVar182,auVar410);
          auVar217._0_4_ = auVar182._0_4_ * auVar182._0_4_ * auVar152._0_4_;
          auVar217._4_4_ = auVar182._4_4_ * auVar182._4_4_ * auVar152._4_4_;
          auVar217._8_4_ = auVar182._8_4_ * auVar182._8_4_ * auVar152._8_4_;
          auVar217._12_4_ = auVar182._12_4_ * auVar182._12_4_ * auVar152._12_4_;
          auVar342 = vfnmadd231ps_fma(auVar217,auVar182,auVar358);
          auVar260._8_4_ = 0xb94ca1f9;
          auVar260._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar260._12_4_ = 0xb94ca1f9;
          auVar279._8_4_ = 0x3c08839e;
          auVar279._0_8_ = 0x3c08839e3c08839e;
          auVar279._12_4_ = 0x3c08839e;
          auVar152 = vfmadd213ps_fma(auVar260,auVar182,auVar279);
          auVar280._8_4_ = 0xbe2aaaa3;
          auVar280._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar280._12_4_ = 0xbe2aaaa3;
          auVar152 = vfmadd213ps_fma(auVar152,auVar182,auVar280);
          auVar183._0_4_ = auVar152._0_4_ * auVar182._0_4_;
          auVar183._4_4_ = auVar152._4_4_ * auVar182._4_4_;
          auVar183._8_4_ = auVar152._8_4_ * auVar182._8_4_;
          auVar183._12_4_ = auVar152._12_4_ * auVar182._12_4_;
          auVar127 = vfmadd213ps_fma(auVar183,auVar127,auVar127);
          auVar152 = vpand_avx(auVar392,auVar257);
          auVar152 = vpcmpeqd_avx(auVar152,_DAT_00592030);
          auVar218._0_4_ = auVar342._0_4_ + 1.0;
          auVar218._4_4_ = auVar342._4_4_ + 1.0;
          auVar218._8_4_ = auVar342._8_4_ + 1.0;
          auVar218._12_4_ = auVar342._12_4_ + 1.0;
          auVar152 = vblendvps_avx(auVar218,auVar127,auVar152);
          auVar127 = vpslld_avx(auVar257,0x1d);
          auVar123._8_4_ = 0x80000000;
          auVar123._0_8_ = 0x8000000080000000;
          auVar123._12_4_ = 0x80000000;
          auVar127 = vpand_avx(auVar127 ^ *(undefined1 (*) [16])pfVar21,auVar123);
          *(undefined1 (*) [16])pfVar21 = auVar127 ^ auVar152;
          pfVar21 = pfVar21 + 4;
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar17;
          auVar29 = vpshufd_avx(auVar34,0x44);
          local_a0._16_16_ = auVar29;
          local_a0._0_16_ = auVar29;
          local_d0 = vpor_avx(auVar29,local_f0);
          local_e0 = vpor_avx(auVar29,local_f0);
          uVar25 = 0;
          auVar139 = _DAT_00595120;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar25;
            auVar29 = vpshufd_avx(auVar35,0x44);
            auVar57._16_16_ = auVar29;
            auVar57._0_16_ = auVar29;
            auVar51 = vorps_avx(auVar57,_DAT_00595100);
            auVar139 = vorps_avx(auVar57,auVar139);
            auVar127 = vpor_avx(local_a0._16_16_,local_f0);
            auVar29 = vpcmpgtq_avx(auVar139._16_16_ ^ local_f0,auVar127);
            auVar152 = vpcmpgtq_avx(auVar139._0_16_ ^ local_f0,local_d0);
            auVar29 = vpackssdw_avx(auVar152,auVar29);
            auVar257 = in_ZMM8._0_16_;
            auVar152 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar127);
            auVar124._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar124._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar124._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar124._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar127 = vpcmpgtq_avx(auVar124,local_e0);
            auVar152 = vpackssdw_avx(auVar127,auVar152);
            auVar29 = vpackssdw_avx(auVar257 ^ auVar152,auVar257 ^ auVar29);
            auVar152 = vpmovsxwd_avx(auVar29);
            auVar29 = vpunpckhwd_avx(auVar29,auVar29);
            local_c0._16_16_ = auVar29;
            local_c0._0_16_ = auVar152;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar21 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = sinf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_01;
            local_160._8_4_ = extraout_XMM0_Dc_01;
            local_160._12_4_ = extraout_XMM0_Dd_01;
            auVar29 = vmovshdup_avx(local_150);
            auVar83._0_4_ = sinf(auVar29._0_4_);
            auVar83._4_60_ = extraout_var_05;
            local_160 = vinsertps_avx(local_160,auVar83._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_150,1);
            auVar84._0_4_ = sinf(auVar29._0_4_);
            auVar84._4_60_ = extraout_var_06;
            local_160 = vinsertps_avx(local_160,auVar84._0_16_,0x20);
            auVar29 = vpermilps_avx(local_150,0xff);
            auVar85._0_4_ = sinf(auVar29._0_4_);
            auVar85._4_60_ = extraout_var_07;
            local_150 = vinsertps_avx(local_160,auVar85._0_16_,0x30);
            local_160._0_4_ = sinf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_02;
            local_160._8_4_ = extraout_XMM0_Dc_02;
            local_160._12_4_ = extraout_XMM0_Dd_02;
            auVar29 = vmovshdup_avx(local_120._0_16_);
            auVar86._0_4_ = sinf(auVar29._0_4_);
            auVar86._4_60_ = extraout_var_08;
            local_160 = vinsertps_avx(local_160,auVar86._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_120._0_16_,1);
            auVar87._0_4_ = sinf(auVar29._0_4_);
            auVar87._4_60_ = extraout_var_09;
            local_160 = vinsertps_avx(local_160,auVar87._0_16_,0x20);
            auVar29 = vpermilps_avx(local_120._0_16_,0xff);
            auVar88._0_4_ = sinf(auVar29._0_4_);
            auVar139 = _DAT_00595120;
            auVar88._4_60_ = extraout_var_10;
            auVar29 = vpcmpeqd_avx(auVar257,auVar257);
            in_ZMM8 = ZEXT1664(auVar29);
            auVar29 = vinsertps_avx(local_160,auVar88._0_16_,0x30);
            auVar58._16_16_ = local_150;
            auVar58._0_16_ = auVar29;
            auVar51 = vmaskmovps_avx(local_c0,auVar58);
            *(undefined1 (*) [32])(pfVar21 + uVar25) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 10:
    local_130 = (ulong)bottom_top_blob->c;
    if (0 < (long)local_130) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_138 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar29 = in_ZMM7._0_16_;
        pfVar21 = (float *)(local_128->cstep * local_138 * local_128->elemsize +
                           (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          uVar19 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar21;
            UnaryOp_x86_fma_functor::unary_op_cos::func_pack8
                      ((unary_op_cos *)&local_161,(__m256 *)local_80);
            auVar29 = in_ZMM7._0_16_;
            *(undefined1 (*) [32])pfVar21 = local_80;
            pfVar21 = pfVar21 + 8;
            uVar24 = uVar19 + 8;
            iVar16 = uVar19 + 0xf;
            uVar19 = uVar24;
          } while (iVar16 < iVar26);
        }
        uVar19 = uVar24 | 3;
        auVar29 = vpcmpeqd_avx(auVar29,auVar29);
        in_ZMM7 = ZEXT1664(auVar29);
        auVar344._8_4_ = 0xfffffffe;
        auVar344._0_8_ = 0xfffffffefffffffe;
        auVar344._12_4_ = 0xfffffffe;
        auVar372._8_4_ = 2;
        auVar372._0_8_ = 0x200000002;
        auVar372._12_4_ = 2;
        auVar432._8_4_ = 0xb97da000;
        auVar432._0_8_ = 0xb97da000b97da000;
        auVar432._12_4_ = 0xb97da000;
        auVar447._8_4_ = 0xb3222169;
        auVar447._0_8_ = 0xb3222169b3222169;
        auVar447._12_4_ = 0xb3222169;
        auVar463._8_4_ = 0xbab6061a;
        auVar463._0_8_ = 0xbab6061abab6061a;
        auVar463._12_4_ = 0xbab6061a;
        auVar480._8_4_ = 0x37ccf5ce;
        auVar480._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar480._12_4_ = 0x37ccf5ce;
        auVar419._8_4_ = 0x3c08839e;
        auVar419._0_8_ = 0x3c08839e3c08839e;
        auVar419._12_4_ = 0x3c08839e;
        auVar266._8_4_ = 0x80000000;
        auVar266._0_8_ = 0x8000000080000000;
        auVar266._12_4_ = 0x80000000;
        while ((int)uVar19 < iVar26) {
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar152 = vandps_avx(auVar43,*(undefined1 (*) [16])pfVar21);
          auVar131._0_4_ = (int)(auVar152._0_4_ * 1.2732395);
          auVar131._4_4_ = (int)(auVar152._4_4_ * 1.2732395);
          auVar131._8_4_ = (int)(auVar152._8_4_ * 1.2732395);
          auVar131._12_4_ = (int)(auVar152._12_4_ * 1.2732395);
          auVar127 = vpsubd_avx(auVar131,auVar29);
          auVar257 = vpand_avx(auVar344,auVar127);
          auVar127 = vcvtdq2ps_avx(auVar257);
          auVar187._8_4_ = 0xbf490000;
          auVar187._0_8_ = 0xbf490000bf490000;
          auVar187._12_4_ = 0xbf490000;
          auVar152 = vfmadd231ps_fma(auVar152,auVar127,auVar187);
          auVar152 = vfmadd231ps_fma(auVar152,auVar127,auVar432);
          auVar342 = vfmadd231ps_fma(auVar152,auVar447,auVar127);
          auVar159._0_4_ = auVar342._0_4_ * auVar342._0_4_;
          auVar159._4_4_ = auVar342._4_4_ * auVar342._4_4_;
          auVar159._8_4_ = auVar342._8_4_ * auVar342._8_4_;
          auVar159._12_4_ = auVar342._12_4_ * auVar342._12_4_;
          auVar152 = vfmadd213ps_fma(auVar480,auVar159,auVar463);
          auVar232._8_4_ = 0x3d2aaaa5;
          auVar232._0_8_ = 0x3d2aaaa53d2aaaa5;
          auVar232._12_4_ = 0x3d2aaaa5;
          auVar152 = vfmadd213ps_fma(auVar152,auVar159,auVar232);
          auVar188._0_4_ = auVar159._0_4_ * auVar159._0_4_ * auVar152._0_4_;
          auVar188._4_4_ = auVar159._4_4_ * auVar159._4_4_ * auVar152._4_4_;
          auVar188._8_4_ = auVar159._8_4_ * auVar159._8_4_ * auVar152._8_4_;
          auVar188._12_4_ = auVar159._12_4_ * auVar159._12_4_ * auVar152._12_4_;
          auVar233._8_4_ = 0x3f000000;
          auVar233._0_8_ = 0x3f0000003f000000;
          auVar233._12_4_ = 0x3f000000;
          auVar368 = vfnmadd231ps_fma(auVar188,auVar159,auVar233);
          auVar234._8_4_ = 0xb94ca1f9;
          auVar234._0_8_ = 0xb94ca1f9b94ca1f9;
          auVar234._12_4_ = 0xb94ca1f9;
          auVar152 = vfmadd213ps_fma(auVar234,auVar159,auVar419);
          auVar290._8_4_ = 0xbe2aaaa3;
          auVar290._0_8_ = 0xbe2aaaa3be2aaaa3;
          auVar290._12_4_ = 0xbe2aaaa3;
          auVar152 = vfmadd213ps_fma(auVar152,auVar159,auVar290);
          auVar160._0_4_ = auVar152._0_4_ * auVar159._0_4_;
          auVar160._4_4_ = auVar152._4_4_ * auVar159._4_4_;
          auVar160._8_4_ = auVar152._8_4_ * auVar159._8_4_;
          auVar160._12_4_ = auVar152._12_4_ * auVar159._12_4_;
          auVar127 = vpaddd_avx(auVar344,auVar257);
          auVar257 = vfmadd213ps_fma(auVar160,auVar342,auVar342);
          auVar152 = vpand_avx(auVar372,auVar127);
          auVar152 = vpcmpeqd_avx(auVar152,_DAT_00592030);
          auVar189._0_4_ = auVar368._0_4_ + 1.0;
          auVar189._4_4_ = auVar368._4_4_ + 1.0;
          auVar189._8_4_ = auVar368._8_4_ + 1.0;
          auVar189._12_4_ = auVar368._12_4_ + 1.0;
          auVar152 = vblendvps_avx(auVar189,auVar257,auVar152);
          auVar127 = vpslld_avx(auVar127,0x1d);
          auVar127 = vpand_avx(auVar127,auVar266);
          *(undefined1 (*) [16])pfVar21 = auVar127 ^ auVar266 ^ auVar152;
          pfVar21 = pfVar21 + 4;
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar17;
          auVar29 = vpshufd_avx(auVar44,0x44);
          local_a0._16_16_ = auVar29;
          local_a0._0_16_ = auVar29;
          local_d0 = vpor_avx(auVar29,local_f0);
          local_e0 = vpor_avx(auVar29,local_f0);
          uVar25 = 0;
          auVar139 = _DAT_00595120;
          do {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar25;
            auVar29 = vpshufd_avx(auVar45,0x44);
            auVar69._16_16_ = auVar29;
            auVar69._0_16_ = auVar29;
            auVar51 = vorps_avx(auVar69,_DAT_00595100);
            auVar139 = vorps_avx(auVar69,auVar139);
            auVar127 = vpor_avx(local_a0._16_16_,local_f0);
            auVar29 = vpcmpgtq_avx(auVar139._16_16_ ^ local_f0,auVar127);
            auVar152 = vpcmpgtq_avx(auVar139._0_16_ ^ local_f0,local_d0);
            auVar29 = vpackssdw_avx(auVar152,auVar29);
            auVar257 = in_ZMM7._0_16_;
            auVar152 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar127);
            auVar132._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar132._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar132._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar132._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar127 = vpcmpgtq_avx(auVar132,local_e0);
            auVar152 = vpackssdw_avx(auVar127,auVar152);
            auVar29 = vpackssdw_avx(auVar152 ^ auVar257,auVar29 ^ auVar257);
            auVar152 = vpmovsxwd_avx(auVar29);
            auVar29 = vpunpckhwd_avx(auVar29,auVar29);
            local_c0._16_16_ = auVar29;
            local_c0._0_16_ = auVar152;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar21 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = cosf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_07;
            local_160._8_4_ = extraout_XMM0_Dc_07;
            local_160._12_4_ = extraout_XMM0_Dd_07;
            auVar29 = vmovshdup_avx(local_150);
            auVar100._0_4_ = cosf(auVar29._0_4_);
            auVar100._4_60_ = extraout_var_23;
            local_160 = vinsertps_avx(local_160,auVar100._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_150,1);
            auVar101._0_4_ = cosf(auVar29._0_4_);
            auVar101._4_60_ = extraout_var_24;
            local_160 = vinsertps_avx(local_160,auVar101._0_16_,0x20);
            auVar29 = vpermilps_avx(local_150,0xff);
            auVar102._0_4_ = cosf(auVar29._0_4_);
            auVar102._4_60_ = extraout_var_25;
            local_150 = vinsertps_avx(local_160,auVar102._0_16_,0x30);
            local_160._0_4_ = cosf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_08;
            local_160._8_4_ = extraout_XMM0_Dc_08;
            local_160._12_4_ = extraout_XMM0_Dd_08;
            auVar29 = vmovshdup_avx(local_120._0_16_);
            auVar103._0_4_ = cosf(auVar29._0_4_);
            auVar103._4_60_ = extraout_var_26;
            local_160 = vinsertps_avx(local_160,auVar103._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_120._0_16_,1);
            auVar104._0_4_ = cosf(auVar29._0_4_);
            auVar104._4_60_ = extraout_var_27;
            local_160 = vinsertps_avx(local_160,auVar104._0_16_,0x20);
            auVar29 = vpermilps_avx(local_120._0_16_,0xff);
            auVar105._0_4_ = cosf(auVar29._0_4_);
            auVar139 = _DAT_00595120;
            auVar105._4_60_ = extraout_var_28;
            auVar29 = vpcmpeqd_avx(auVar257,auVar257);
            in_ZMM7 = ZEXT1664(auVar29);
            auVar29 = vinsertps_avx(local_160,auVar105._0_16_,0x30);
            auVar70._16_16_ = local_150;
            auVar70._0_16_ = auVar29;
            auVar51 = vmaskmovps_avx(local_c0,auVar70);
            *(undefined1 (*) [32])(pfVar21 + uVar25) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_130);
    }
    break;
  case 0xb:
    local_60 = (long)bottom_top_blob->c;
    if (0 < local_60) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      local_138 = CONCAT44(local_138._4_4_,iVar26);
      do {
        pfVar21 = (float *)(local_128->cstep * local_130 * local_128->elemsize +
                           (long)local_128->data);
        iVar16 = (int)local_138;
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          uVar19 = 0;
          do {
            local_80 = *(undefined1 (*) [32])pfVar21;
            UnaryOp_x86_fma_functor::unary_op_tan::func_pack8(&local_161,(__m256 *)local_80);
            *(undefined1 (*) [32])pfVar21 = local_80;
            pfVar21 = pfVar21 + 8;
            uVar24 = uVar19 + 8;
            iVar26 = uVar19 + 0xf;
            uVar19 = uVar24;
          } while (iVar26 < iVar16);
        }
        auVar29 = in_ZMM5._0_16_;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar16) {
          auVar112 = ZEXT856(*(ulong *)(pfVar21 + 2));
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          local_80._0_16_ = (undefined1  [16])*(__m128 *)pfVar21;
          afVar487 = UnaryOp_x86_fma_functor::unary_op_tan::func_pack4
                               (&local_161,(__m128 *)local_80);
          auVar29 = in_ZMM5._0_16_;
          auVar76._0_8_ = afVar487._0_8_;
          auVar76._8_56_ = auVar112;
          local_80._0_16_ = auVar76._0_16_;
          *(undefined1 (*) [16])pfVar21 = auVar76._0_16_;
          pfVar21 = pfVar21 + 4;
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar29,auVar29);
        in_ZMM5 = ZEXT1664(auVar29);
        if ((int)uVar24 < iVar16) {
          uVar17 = CONCAT44(0,~uVar24 + (int)local_138);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar17;
          auVar152 = vpshufd_avx(auVar32,0x44);
          auVar29 = vpor_avx(auVar152,local_f0);
          local_a0._0_16_ = auVar29;
          local_d0 = vpor_avx(auVar152,local_f0);
          local_e0 = vpor_avx(auVar152,local_f0);
          uVar25 = 0;
          auVar139 = _DAT_00595100;
          auVar51 = _DAT_00595120;
          do {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar25;
            auVar29 = vpshufd_avx(auVar33,0x44);
            auVar54._16_16_ = auVar29;
            auVar54._0_16_ = auVar29;
            auVar139 = vorps_avx(auVar54,auVar139);
            auVar51 = vorps_avx(auVar54,auVar51);
            auVar29 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,local_a0._0_16_);
            auVar152 = vpcmpgtq_avx(auVar51._0_16_ ^ local_f0,local_d0);
            auVar29 = vpackssdw_avx(auVar152,auVar29);
            auVar257 = in_ZMM5._0_16_;
            auVar152 = vpcmpgtq_avx(auVar139._16_16_ ^ local_f0,local_a0._0_16_);
            auVar118._0_4_ = auVar139._0_4_ ^ local_f0._0_4_;
            auVar118._4_4_ = auVar139._4_4_ ^ local_f0._4_4_;
            auVar118._8_4_ = auVar139._8_4_ ^ local_f0._8_4_;
            auVar118._12_4_ = auVar139._12_4_ ^ local_f0._12_4_;
            auVar127 = vpcmpgtq_avx(auVar118,local_e0);
            auVar152 = vpackssdw_avx(auVar127,auVar152);
            auVar29 = vpackssdw_avx(auVar152 ^ auVar257,auVar29 ^ auVar257);
            auVar152 = vpmovsxwd_avx(auVar29);
            auVar29 = vpunpckhwd_avx(auVar29,auVar29);
            local_c0._16_16_ = auVar29;
            local_c0._0_16_ = auVar152;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(pfVar21 + uVar25));
            local_150 = local_120._16_16_;
            local_160._0_4_ = tanf(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db;
            local_160._8_4_ = extraout_XMM0_Dc;
            local_160._12_4_ = extraout_XMM0_Dd;
            auVar29 = vmovshdup_avx(local_150);
            auVar77._0_4_ = tanf(auVar29._0_4_);
            auVar77._4_60_ = extraout_var;
            local_160 = vinsertps_avx(local_160,auVar77._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_150,1);
            auVar78._0_4_ = tanf(auVar29._0_4_);
            auVar78._4_60_ = extraout_var_00;
            local_160 = vinsertps_avx(local_160,auVar78._0_16_,0x20);
            auVar29 = vpermilps_avx(local_150,0xff);
            auVar79._0_4_ = tanf(auVar29._0_4_);
            auVar79._4_60_ = extraout_var_01;
            local_150 = vinsertps_avx(local_160,auVar79._0_16_,0x30);
            local_160._0_4_ = tanf((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_00;
            local_160._8_4_ = extraout_XMM0_Dc_00;
            local_160._12_4_ = extraout_XMM0_Dd_00;
            auVar29 = vmovshdup_avx(local_120._0_16_);
            auVar80._0_4_ = tanf(auVar29._0_4_);
            auVar80._4_60_ = extraout_var_02;
            local_160 = vinsertps_avx(local_160,auVar80._0_16_,0x10);
            auVar29 = vpermilpd_avx(local_120._0_16_,1);
            auVar81._0_4_ = tanf(auVar29._0_4_);
            auVar81._4_60_ = extraout_var_03;
            local_160 = vinsertps_avx(local_160,auVar81._0_16_,0x20);
            auVar29 = vpermilps_avx(local_120._0_16_,0xff);
            auVar82._0_4_ = tanf(auVar29._0_4_);
            auVar51 = _DAT_00595120;
            auVar139 = _DAT_00595100;
            auVar82._4_60_ = extraout_var_04;
            auVar29 = vpcmpeqd_avx(auVar257,auVar257);
            in_ZMM5 = ZEXT1664(auVar29);
            auVar29 = vinsertps_avx(local_160,auVar82._0_16_,0x30);
            auVar55._16_16_ = local_150;
            auVar55._0_16_ = auVar29;
            auVar196 = vmaskmovps_avx(local_c0,auVar55);
            *(undefined1 (*) [32])(pfVar21 + uVar25) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        local_130 = local_130 + 1;
        iVar26 = (int)local_138;
      } while (local_130 != local_60);
    }
    break;
  case 0xc:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar452._8_4_ = 0x3d2dbdcf;
        auVar452._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar436._8_4_ = 0x80000000;
        auVar436._0_8_ = 0x8000000080000000;
        auVar421._8_4_ = 0xc0400000;
        auVar421._0_8_ = 0xc0400000c0400000;
        auVar400._8_4_ = 0x3f800000;
        auVar400._0_8_ = 0x3f8000003f800000;
        auVar378._8_4_ = 0x3f000000;
        auVar378._0_8_ = 0x3f0000003f000000;
        auVar347._8_4_ = 0x7fffffff;
        auVar347._0_8_ = 0x7fffffff7fffffff;
        auVar137._8_4_ = 0x3d3a73d8;
        auVar137._0_8_ = 0x3d3a73d83d3a73d8;
        auVar56._8_4_ = 0x800000;
        auVar56._0_8_ = 0x80000000800000;
        auVar452._12_4_ = 0x3d2dbdcf;
        auVar436._12_4_ = 0x80000000;
        auVar421._12_4_ = 0xc0400000;
        auVar400._12_4_ = 0x3f800000;
        auVar378._12_4_ = 0x3f000000;
        auVar347._12_4_ = 0x7fffffff;
        auVar137._12_4_ = 0x3d3a73d8;
        auVar56._12_4_ = 0x800000;
        auVar452._16_4_ = 0x3d2dbdcf;
        auVar436._16_4_ = 0x80000000;
        auVar421._16_4_ = 0xc0400000;
        auVar400._16_4_ = 0x3f800000;
        auVar378._16_4_ = 0x3f000000;
        auVar347._16_4_ = 0x7fffffff;
        auVar137._16_4_ = 0x3d3a73d8;
        auVar56._16_4_ = 0x800000;
        auVar452._20_4_ = 0x3d2dbdcf;
        auVar436._20_4_ = 0x80000000;
        auVar421._20_4_ = 0xc0400000;
        auVar400._20_4_ = 0x3f800000;
        auVar378._20_4_ = 0x3f000000;
        auVar347._20_4_ = 0x7fffffff;
        auVar137._20_4_ = 0x3d3a73d8;
        auVar56._20_4_ = 0x800000;
        auVar452._24_4_ = 0x3d2dbdcf;
        auVar436._24_4_ = 0x80000000;
        auVar421._24_4_ = 0xc0400000;
        auVar400._24_4_ = 0x3f800000;
        auVar378._24_4_ = 0x3f000000;
        auVar347._24_4_ = 0x7fffffff;
        auVar137._24_4_ = 0x3d3a73d8;
        auVar56._24_4_ = 0x800000;
        auVar452._28_4_ = 0x3d2dbdcf;
        auVar436._28_4_ = 0x80000000;
        auVar421._28_4_ = 0xc0400000;
        auVar400._28_4_ = 0x3f800000;
        auVar378._28_4_ = 0x3f000000;
        auVar347._28_4_ = 0x7fffffff;
        auVar137._28_4_ = 0x3d3a73d8;
        auVar56._28_4_ = 0x800000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar295._8_4_ = 0x3e2aaaf8;
            auVar295._0_8_ = 0x3e2aaaf83e2aaaf8;
            auVar295._12_4_ = 0x3e2aaaf8;
            auVar295._16_4_ = 0x3e2aaaf8;
            auVar295._20_4_ = 0x3e2aaaf8;
            auVar295._24_4_ = 0x3e2aaaf8;
            auVar295._28_4_ = 0x3e2aaaf8;
            auVar139 = vandps_avx(auVar347,*pauVar23);
            auVar152 = vfnmadd213ps_fma(auVar378,auVar139,auVar378);
            auVar51 = vrsqrtps_avx(ZEXT1632(auVar152));
            auVar270 = vcmpps_avx(auVar378,auVar139,1);
            auVar273._0_4_ = auVar152._0_4_ * auVar51._0_4_;
            auVar273._4_4_ = auVar152._4_4_ * auVar51._4_4_;
            auVar273._8_4_ = auVar152._8_4_ * auVar51._8_4_;
            auVar273._12_4_ = auVar152._12_4_ * auVar51._12_4_;
            auVar273._16_4_ = auVar51._16_4_ * 0.0;
            auVar273._20_4_ = auVar51._20_4_ * 0.0;
            auVar273._28_36_ = in_ZMM5._28_36_;
            auVar273._24_4_ = auVar51._24_4_ * 0.0;
            auVar29 = vfmadd213ps_fma(auVar51,auVar273._0_32_,auVar421);
            auVar194._0_4_ = auVar273._0_4_ * -0.5 * auVar29._0_4_;
            auVar194._4_4_ = auVar273._4_4_ * -0.5 * auVar29._4_4_;
            auVar194._8_4_ = auVar273._8_4_ * -0.5 * auVar29._8_4_;
            auVar194._12_4_ = auVar273._12_4_ * -0.5 * auVar29._12_4_;
            auVar194._16_4_ = auVar273._16_4_ * -0.5 * 0.0;
            auVar194._20_4_ = auVar273._20_4_ * -0.5 * 0.0;
            auVar194._24_4_ = auVar273._24_4_ * -0.5 * 0.0;
            auVar194._28_4_ = 0;
            auVar51 = vandps_avx(auVar347,ZEXT1632(auVar152));
            auVar51 = vcmpps_avx(auVar56,auVar51,2);
            auVar51 = vandps_avx(auVar51,auVar194);
            auVar196 = vblendvps_avx(auVar139,auVar51,auVar270);
            fVar27 = auVar196._0_4_;
            fVar176 = fVar27 * fVar27;
            fVar201 = auVar196._4_4_;
            fVar202 = fVar201 * fVar201;
            auVar6._4_4_ = fVar202;
            auVar6._0_4_ = fVar176;
            fVar203 = auVar196._8_4_;
            fVar204 = fVar203 * fVar203;
            auVar6._8_4_ = fVar204;
            fVar205 = auVar196._12_4_;
            fVar206 = fVar205 * fVar205;
            auVar6._12_4_ = fVar206;
            fVar173 = auVar196._16_4_;
            fVar207 = fVar173 * fVar173;
            auVar6._16_4_ = fVar207;
            fVar174 = auVar196._20_4_;
            fVar208 = fVar174 * fVar174;
            auVar6._20_4_ = fVar208;
            fVar175 = auVar196._24_4_;
            fVar209 = fVar175 * fVar175;
            auVar6._24_4_ = fVar209;
            auVar6._28_4_ = auVar51._28_4_;
            auVar7._4_4_ = fVar202 * fVar202;
            auVar7._0_4_ = fVar176 * fVar176;
            auVar7._8_4_ = fVar204 * fVar204;
            auVar7._12_4_ = fVar206 * fVar206;
            auVar7._16_4_ = fVar207 * fVar207;
            auVar7._20_4_ = fVar208 * fVar208;
            auVar7._24_4_ = fVar209 * fVar209;
            auVar7._28_4_ = 0;
            auVar29 = vfmadd213ps_fma(auVar452,auVar7,auVar137);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar7,auVar295);
            in_ZMM5 = ZEXT1664(auVar29);
            auVar296._8_4_ = 0x3cc48f19;
            auVar296._0_8_ = 0x3cc48f193cc48f19;
            auVar296._12_4_ = 0x3cc48f19;
            auVar296._16_4_ = 0x3cc48f19;
            auVar296._20_4_ = 0x3cc48f19;
            auVar296._24_4_ = 0x3cc48f19;
            auVar296._28_4_ = 0x3cc48f19;
            auVar324._8_4_ = 0x3d997dcc;
            auVar324._0_8_ = 0x3d997dcc3d997dcc;
            auVar324._12_4_ = 0x3d997dcc;
            auVar324._16_4_ = 0x3d997dcc;
            auVar324._20_4_ = 0x3d997dcc;
            auVar324._24_4_ = 0x3d997dcc;
            auVar324._28_4_ = 0x3d997dcc;
            auVar152 = vfmadd213ps_fma(auVar296,auVar7,auVar324);
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar7,auVar400);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar6,ZEXT1632(auVar29));
            auVar139 = vandps_avx(auVar400,auVar270);
            auVar8._4_4_ = auVar29._4_4_ * fVar201;
            auVar8._0_4_ = auVar29._0_4_ * fVar27;
            auVar8._8_4_ = auVar29._8_4_ * fVar203;
            auVar8._12_4_ = auVar29._12_4_ * fVar205;
            auVar8._16_4_ = fVar173 * 0.0;
            auVar8._20_4_ = fVar174 * 0.0;
            auVar8._24_4_ = fVar175 * 0.0;
            auVar8._28_4_ = auVar196._28_4_;
            auVar29 = vfmadd213ps_fma(auVar421,auVar139,auVar400);
            auVar9._4_4_ = auVar139._4_4_ * 1.5707964;
            auVar9._0_4_ = auVar139._0_4_ * 1.5707964;
            auVar9._8_4_ = auVar139._8_4_ * 1.5707964;
            auVar9._12_4_ = auVar139._12_4_ * 1.5707964;
            auVar9._16_4_ = auVar139._16_4_ * 1.5707964;
            auVar9._20_4_ = auVar139._20_4_ * 1.5707964;
            auVar9._24_4_ = auVar139._24_4_ * 1.5707964;
            auVar9._28_4_ = auVar139._28_4_;
            auVar29 = vfmadd231ps_fma(auVar9,auVar8,ZEXT1632(auVar29));
            auVar139 = vandps_avx(auVar436,*pauVar23);
            auVar139 = vorps_avx(auVar139,ZEXT1632(auVar29));
            *pauVar23 = auVar139;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_150._0_4_;
        }
        auVar338._8_4_ = 0x7fffffff;
        auVar338._0_8_ = 0x7fffffff7fffffff;
        auVar338._12_4_ = 0x7fffffff;
        auVar357._8_4_ = 0x3f000000;
        auVar357._0_8_ = 0x3f0000003f000000;
        auVar357._12_4_ = 0x3f000000;
        auVar391._8_4_ = 0x3f800000;
        auVar391._0_8_ = 0x3f8000003f800000;
        auVar391._12_4_ = 0x3f800000;
        auVar409._8_4_ = 0xc0400000;
        auVar409._0_8_ = 0xc0400000c0400000;
        auVar409._12_4_ = 0xc0400000;
        auVar441._8_4_ = 0x800000;
        auVar441._0_8_ = 0x80000000800000;
        auVar441._12_4_ = 0x800000;
        auVar458._8_4_ = 0x3d3a73d8;
        auVar458._0_8_ = 0x3d3a73d83d3a73d8;
        auVar458._12_4_ = 0x3d3a73d8;
        auVar471._8_4_ = 0x3d2dbdcf;
        auVar471._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar471._12_4_ = 0x3d2dbdcf;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar29 = vandps_avx(auVar338,*(undefined1 (*) [16])*pauVar23);
          auVar127 = vcmpps_avx(auVar357,auVar29,1);
          auVar257 = vfnmadd213ps_fma(auVar357,auVar29,auVar357);
          auVar152 = vrsqrtps_avx(auVar257);
          auVar258._0_4_ = auVar257._0_4_ * auVar152._0_4_;
          auVar258._4_4_ = auVar257._4_4_ * auVar152._4_4_;
          auVar258._8_4_ = auVar257._8_4_ * auVar152._8_4_;
          auVar258._12_4_ = auVar257._12_4_ * auVar152._12_4_;
          auVar152 = vfmadd213ps_fma(auVar152,auVar258,auVar409);
          auVar215._0_4_ = auVar258._0_4_ * -0.5 * auVar152._0_4_;
          auVar215._4_4_ = auVar258._4_4_ * -0.5 * auVar152._4_4_;
          auVar215._8_4_ = auVar258._8_4_ * -0.5 * auVar152._8_4_;
          auVar215._12_4_ = auVar258._12_4_ * -0.5 * auVar152._12_4_;
          auVar152 = vandps_avx(auVar338,auVar257);
          auVar152 = vcmpps_avx(auVar441,auVar152,2);
          auVar152 = vandps_avx(auVar152,auVar215);
          auVar29 = vblendvps_avx(auVar29,auVar152,auVar127);
          fVar27 = auVar29._0_4_;
          auVar180._0_4_ = fVar27 * fVar27;
          fVar201 = auVar29._4_4_;
          auVar180._4_4_ = fVar201 * fVar201;
          fVar203 = auVar29._8_4_;
          auVar180._8_4_ = fVar203 * fVar203;
          fVar205 = auVar29._12_4_;
          auVar180._12_4_ = fVar205 * fVar205;
          auVar216._0_4_ = auVar180._0_4_ * auVar180._0_4_;
          auVar216._4_4_ = auVar180._4_4_ * auVar180._4_4_;
          auVar216._8_4_ = auVar180._8_4_ * auVar180._8_4_;
          auVar216._12_4_ = auVar180._12_4_ * auVar180._12_4_;
          auVar29 = vfmadd213ps_fma(auVar471,auVar216,auVar458);
          auVar277._8_4_ = 0x3e2aaaf8;
          auVar277._0_8_ = 0x3e2aaaf83e2aaaf8;
          auVar277._12_4_ = 0x3e2aaaf8;
          auVar29 = vfmadd213ps_fma(auVar29,auVar216,auVar277);
          in_ZMM5 = ZEXT1664(auVar29);
          auVar278._8_4_ = 0x3cc48f19;
          auVar278._0_8_ = 0x3cc48f193cc48f19;
          auVar278._12_4_ = 0x3cc48f19;
          auVar307._8_4_ = 0x3d997dcc;
          auVar307._0_8_ = 0x3d997dcc3d997dcc;
          auVar307._12_4_ = 0x3d997dcc;
          auVar152 = vfmadd213ps_fma(auVar278,auVar216,auVar307);
          auVar152 = vfmadd213ps_fma(auVar152,auVar216,auVar391);
          auVar152 = vfmadd231ps_fma(auVar152,auVar180,auVar29);
          auVar29 = vandps_avx(auVar391,auVar127);
          auVar119._0_4_ = auVar152._0_4_ * fVar27;
          auVar119._4_4_ = auVar152._4_4_ * fVar201;
          auVar119._8_4_ = auVar152._8_4_ * fVar203;
          auVar119._12_4_ = auVar152._12_4_ * fVar205;
          auVar152 = vfmadd213ps_fma(auVar409,auVar29,auVar391);
          auVar147._0_4_ = auVar29._0_4_ * 1.5707964;
          auVar147._4_4_ = auVar29._4_4_ * 1.5707964;
          auVar147._8_4_ = auVar29._8_4_ * 1.5707964;
          auVar147._12_4_ = auVar29._12_4_ * 1.5707964;
          auVar152 = vfmadd231ps_fma(auVar147,auVar119,auVar152);
          auVar120._8_4_ = 0x80000000;
          auVar120._0_8_ = 0x8000000080000000;
          auVar120._12_4_ = 0x80000000;
          auVar29 = vandps_avx(*(undefined1 (*) [16])*pauVar23,auVar120);
          auVar29 = vorps_avx(auVar29,auVar152);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar27 = asinf(*(float *)(*pauVar23 + lVar20 * 4));
            *(float *)(*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xd:
    local_150._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_c0._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar466._8_4_ = 0x3d2dbdcf;
        auVar466._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar454._8_4_ = 0x3e2aaaf8;
        auVar454._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar437._8_4_ = 0x800000;
        auVar437._0_8_ = 0x80000000800000;
        auVar424._8_4_ = 0x3d3a73d8;
        auVar424._0_8_ = 0x3d3a73d83d3a73d8;
        auVar402._8_4_ = 0xc0400000;
        auVar402._0_8_ = 0xc0400000c0400000;
        auVar384._8_4_ = 0x3f000000;
        auVar384._0_8_ = 0x3f0000003f000000;
        auVar350._8_4_ = 0x7fffffff;
        auVar350._0_8_ = 0x7fffffff7fffffff;
        auVar331._8_4_ = 0x80000000;
        auVar331._0_8_ = 0x8000000080000000;
        auVar466._12_4_ = 0x3d2dbdcf;
        auVar454._12_4_ = 0x3e2aaaf8;
        auVar437._12_4_ = 0x800000;
        auVar424._12_4_ = 0x3d3a73d8;
        auVar402._12_4_ = 0xc0400000;
        auVar384._12_4_ = 0x3f000000;
        auVar350._12_4_ = 0x7fffffff;
        auVar331._12_4_ = 0x80000000;
        auVar466._16_4_ = 0x3d2dbdcf;
        auVar454._16_4_ = 0x3e2aaaf8;
        auVar437._16_4_ = 0x800000;
        auVar424._16_4_ = 0x3d3a73d8;
        auVar402._16_4_ = 0xc0400000;
        auVar384._16_4_ = 0x3f000000;
        auVar350._16_4_ = 0x7fffffff;
        auVar331._16_4_ = 0x80000000;
        auVar466._20_4_ = 0x3d2dbdcf;
        auVar454._20_4_ = 0x3e2aaaf8;
        auVar437._20_4_ = 0x800000;
        auVar424._20_4_ = 0x3d3a73d8;
        auVar402._20_4_ = 0xc0400000;
        auVar384._20_4_ = 0x3f000000;
        auVar350._20_4_ = 0x7fffffff;
        auVar331._20_4_ = 0x80000000;
        auVar466._24_4_ = 0x3d2dbdcf;
        auVar454._24_4_ = 0x3e2aaaf8;
        auVar437._24_4_ = 0x800000;
        auVar424._24_4_ = 0x3d3a73d8;
        auVar402._24_4_ = 0xc0400000;
        auVar384._24_4_ = 0x3f000000;
        auVar350._24_4_ = 0x7fffffff;
        auVar331._24_4_ = 0x80000000;
        auVar466._28_4_ = 0x3d2dbdcf;
        auVar454._28_4_ = 0x3e2aaaf8;
        auVar437._28_4_ = 0x800000;
        auVar424._28_4_ = 0x3d3a73d8;
        auVar402._28_4_ = 0xc0400000;
        auVar384._28_4_ = 0x3f000000;
        auVar350._28_4_ = 0x7fffffff;
        auVar331._28_4_ = 0x80000000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar139 = *pauVar23;
            auVar51 = vandps_avx(auVar350,auVar139);
            local_120 = vcmpps_avx(auVar384,auVar51,1);
            auVar152 = vfnmadd213ps_fma(auVar384,auVar51,auVar384);
            auVar196 = vrsqrtps_avx(ZEXT1632(auVar152));
            auVar274._0_4_ = auVar152._0_4_ * auVar196._0_4_;
            auVar274._4_4_ = auVar152._4_4_ * auVar196._4_4_;
            auVar274._8_4_ = auVar152._8_4_ * auVar196._8_4_;
            auVar274._12_4_ = auVar152._12_4_ * auVar196._12_4_;
            auVar274._16_4_ = auVar196._16_4_ * 0.0;
            auVar274._20_4_ = auVar196._20_4_ * 0.0;
            auVar274._28_36_ = in_ZMM5._28_36_;
            auVar274._24_4_ = auVar196._24_4_ * 0.0;
            auVar29 = vfmadd213ps_fma(auVar196,auVar274._0_32_,auVar402);
            auVar249._0_4_ = auVar274._0_4_ * -0.5 * auVar29._0_4_;
            auVar249._4_4_ = auVar274._4_4_ * -0.5 * auVar29._4_4_;
            auVar249._8_4_ = auVar274._8_4_ * -0.5 * auVar29._8_4_;
            auVar249._12_4_ = auVar274._12_4_ * -0.5 * auVar29._12_4_;
            auVar249._16_4_ = auVar274._16_4_ * -0.5 * 0.0;
            auVar249._20_4_ = auVar274._20_4_ * -0.5 * 0.0;
            auVar249._24_4_ = auVar274._24_4_ * -0.5 * 0.0;
            auVar249._28_4_ = 0;
            auVar196 = vandps_avx(auVar350,ZEXT1632(auVar152));
            auVar196 = vcmpps_avx(auVar437,auVar196,2);
            auVar196 = vandps_avx(auVar196,auVar249);
            auVar270 = vblendvps_avx(auVar51,auVar196,local_120);
            fVar27 = auVar270._0_4_;
            fVar176 = fVar27 * fVar27;
            fVar201 = auVar270._4_4_;
            fVar202 = fVar201 * fVar201;
            auVar12._4_4_ = fVar202;
            auVar12._0_4_ = fVar176;
            fVar203 = auVar270._8_4_;
            fVar204 = fVar203 * fVar203;
            auVar12._8_4_ = fVar204;
            fVar205 = auVar270._12_4_;
            fVar206 = fVar205 * fVar205;
            auVar12._12_4_ = fVar206;
            fVar173 = auVar270._16_4_;
            fVar207 = fVar173 * fVar173;
            auVar12._16_4_ = fVar207;
            fVar174 = auVar270._20_4_;
            fVar208 = fVar174 * fVar174;
            auVar12._20_4_ = fVar208;
            fVar175 = auVar270._24_4_;
            fVar209 = fVar175 * fVar175;
            auVar12._24_4_ = fVar209;
            auVar12._28_4_ = auVar196._28_4_;
            auVar13._4_4_ = fVar202 * fVar202;
            auVar13._0_4_ = fVar176 * fVar176;
            auVar13._8_4_ = fVar204 * fVar204;
            auVar13._12_4_ = fVar206 * fVar206;
            auVar13._16_4_ = fVar207 * fVar207;
            auVar13._20_4_ = fVar208 * fVar208;
            auVar13._24_4_ = fVar209 * fVar209;
            auVar13._28_4_ = 0;
            auVar29 = vfmadd213ps_fma(auVar466,auVar13,auVar424);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar13,auVar454);
            auVar299._8_4_ = 0x3cc48f19;
            auVar299._0_8_ = 0x3cc48f193cc48f19;
            auVar299._12_4_ = 0x3cc48f19;
            auVar299._16_4_ = 0x3cc48f19;
            auVar299._20_4_ = 0x3cc48f19;
            auVar299._24_4_ = 0x3cc48f19;
            auVar299._28_4_ = 0x3cc48f19;
            auVar332._8_4_ = 0x3d997dcc;
            auVar332._0_8_ = 0x3d997dcc3d997dcc;
            auVar332._12_4_ = 0x3d997dcc;
            auVar332._16_4_ = 0x3d997dcc;
            auVar332._20_4_ = 0x3d997dcc;
            auVar332._24_4_ = 0x3d997dcc;
            auVar332._28_4_ = 0x3d997dcc;
            auVar152 = vfmadd213ps_fma(auVar299,auVar13,auVar332);
            auVar403._8_4_ = 0x3f800000;
            auVar403._0_8_ = 0x3f8000003f800000;
            auVar403._12_4_ = 0x3f800000;
            auVar403._16_4_ = 0x3f800000;
            auVar403._20_4_ = 0x3f800000;
            auVar403._24_4_ = 0x3f800000;
            auVar403._28_4_ = 0x3f800000;
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar13,auVar403);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar12,ZEXT1632(auVar29));
            in_ZMM5 = ZEXT864(0) << 0x20;
            auVar51 = vandps_avx(auVar139,auVar331);
            fVar27 = auVar29._0_4_ * fVar27;
            fVar201 = auVar29._4_4_ * fVar201;
            auVar14._4_4_ = fVar201;
            auVar14._0_4_ = fVar27;
            fVar203 = auVar29._8_4_ * fVar203;
            auVar14._8_4_ = fVar203;
            fVar205 = auVar29._12_4_ * fVar205;
            auVar14._12_4_ = fVar205;
            fVar173 = fVar173 * 0.0;
            auVar14._16_4_ = fVar173;
            fVar174 = fVar174 * 0.0;
            auVar14._20_4_ = fVar174;
            fVar176 = auVar270._28_4_;
            fVar175 = fVar175 * 0.0;
            auVar14._24_4_ = fVar175;
            auVar14._28_4_ = fVar176;
            auVar196 = vorps_avx(auVar51,auVar14);
            auVar169._0_4_ = fVar27 + fVar27;
            auVar169._4_4_ = fVar201 + fVar201;
            auVar169._8_4_ = fVar203 + fVar203;
            auVar169._12_4_ = fVar205 + fVar205;
            auVar169._16_4_ = fVar173 + fVar173;
            auVar169._20_4_ = fVar174 + fVar174;
            auVar169._24_4_ = fVar175 + fVar175;
            auVar169._28_4_ = fVar176 + fVar176;
            auVar51 = vorps_avx(auVar51,auVar169);
            auVar139 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,1);
            auVar199._8_4_ = 0x40490fdb;
            auVar199._0_8_ = 0x40490fdb40490fdb;
            auVar199._12_4_ = 0x40490fdb;
            auVar199._16_4_ = 0x40490fdb;
            auVar199._20_4_ = 0x40490fdb;
            auVar199._24_4_ = 0x40490fdb;
            auVar199._28_4_ = 0x40490fdb;
            auVar139 = vandps_avx(auVar139,auVar199);
            auVar141._0_4_ = auVar139._0_4_ + auVar51._0_4_;
            auVar141._4_4_ = auVar139._4_4_ + auVar51._4_4_;
            auVar141._8_4_ = auVar139._8_4_ + auVar51._8_4_;
            auVar141._12_4_ = auVar139._12_4_ + auVar51._12_4_;
            auVar141._16_4_ = auVar139._16_4_ + auVar51._16_4_;
            auVar141._20_4_ = auVar139._20_4_ + auVar51._20_4_;
            auVar141._24_4_ = auVar139._24_4_ + auVar51._24_4_;
            auVar141._28_4_ = auVar139._28_4_ + auVar51._28_4_;
            auVar170._8_4_ = 0x3fc90fdb;
            auVar170._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar170._12_4_ = 0x3fc90fdb;
            auVar170._16_4_ = 0x3fc90fdb;
            auVar170._20_4_ = 0x3fc90fdb;
            auVar170._24_4_ = 0x3fc90fdb;
            auVar170._28_4_ = 0x3fc90fdb;
            auVar139 = vsubps_avx(auVar170,auVar196);
            auVar139 = vblendvps_avx(auVar139,auVar141,local_120);
            *pauVar23 = auVar139;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_c0._0_4_;
        }
        auVar343._8_4_ = 0x7fffffff;
        auVar343._0_8_ = 0x7fffffff7fffffff;
        auVar343._12_4_ = 0x7fffffff;
        auVar369._8_4_ = 0x3f000000;
        auVar369._0_8_ = 0x3f0000003f000000;
        auVar369._12_4_ = 0x3f000000;
        auVar462._8_4_ = 0x3d2dbdcf;
        auVar462._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar462._12_4_ = 0x3d2dbdcf;
        auVar479._8_4_ = 0x3e2aaaf8;
        auVar479._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar479._12_4_ = 0x3e2aaaf8;
        auVar315._8_4_ = 0x3f800000;
        auVar315._0_8_ = 0x3f8000003f800000;
        auVar315._12_4_ = 0x3f800000;
        auVar397._8_4_ = 0x3fc90fdb;
        auVar397._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar397._12_4_ = 0x3fc90fdb;
        auVar431._8_4_ = 0x40490fdb;
        auVar431._0_8_ = 0x40490fdb40490fdb;
        auVar431._12_4_ = 0x40490fdb;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar29 = *(undefined1 (*) [16])*pauVar23;
          auVar152 = vandps_avx(auVar343,auVar29);
          auVar257 = vcmpps_avx(auVar369,auVar152,1);
          auVar342 = vfnmadd213ps_fma(auVar369,auVar152,auVar369);
          auVar127 = vrsqrtps_avx(auVar342);
          auVar264._0_4_ = auVar342._0_4_ * auVar127._0_4_;
          auVar264._4_4_ = auVar342._4_4_ * auVar127._4_4_;
          auVar264._8_4_ = auVar342._8_4_ * auVar127._8_4_;
          auVar264._12_4_ = auVar342._12_4_ * auVar127._12_4_;
          auVar286._8_4_ = 0xc0400000;
          auVar286._0_8_ = 0xc0400000c0400000;
          auVar286._12_4_ = 0xc0400000;
          auVar127 = vfmadd213ps_fma(auVar127,auVar264,auVar286);
          auVar230._0_4_ = auVar264._0_4_ * -0.5 * auVar127._0_4_;
          auVar230._4_4_ = auVar264._4_4_ * -0.5 * auVar127._4_4_;
          auVar230._8_4_ = auVar264._8_4_ * -0.5 * auVar127._8_4_;
          auVar230._12_4_ = auVar264._12_4_ * -0.5 * auVar127._12_4_;
          auVar127 = vandps_avx(auVar343,auVar342);
          auVar265._8_4_ = 0x800000;
          auVar265._0_8_ = 0x80000000800000;
          auVar265._12_4_ = 0x800000;
          auVar127 = vcmpps_avx(auVar265,auVar127,2);
          auVar127 = vandps_avx(auVar127,auVar230);
          auVar152 = vblendvps_avx(auVar152,auVar127,auVar257);
          fVar27 = auVar152._0_4_;
          auVar185._0_4_ = fVar27 * fVar27;
          fVar201 = auVar152._4_4_;
          auVar185._4_4_ = fVar201 * fVar201;
          fVar203 = auVar152._8_4_;
          auVar185._8_4_ = fVar203 * fVar203;
          fVar205 = auVar152._12_4_;
          auVar185._12_4_ = fVar205 * fVar205;
          auVar231._0_4_ = auVar185._0_4_ * auVar185._0_4_;
          auVar231._4_4_ = auVar185._4_4_ * auVar185._4_4_;
          auVar231._8_4_ = auVar185._8_4_ * auVar185._8_4_;
          auVar231._12_4_ = auVar185._12_4_ * auVar185._12_4_;
          auVar287._8_4_ = 0x3d3a73d8;
          auVar287._0_8_ = 0x3d3a73d83d3a73d8;
          auVar287._12_4_ = 0x3d3a73d8;
          auVar152 = vfmadd213ps_fma(auVar462,auVar231,auVar287);
          auVar152 = vfmadd213ps_fma(auVar152,auVar231,auVar479);
          in_ZMM5 = ZEXT1664(auVar152);
          auVar288._8_4_ = 0x3cc48f19;
          auVar288._0_8_ = 0x3cc48f193cc48f19;
          auVar288._12_4_ = 0x3cc48f19;
          auVar446._8_4_ = 0x3d997dcc;
          auVar446._0_8_ = 0x3d997dcc3d997dcc;
          auVar446._12_4_ = 0x3d997dcc;
          auVar127 = vfmadd213ps_fma(auVar288,auVar231,auVar446);
          auVar127 = vfmadd213ps_fma(auVar127,auVar231,auVar315);
          auVar127 = vfmadd231ps_fma(auVar127,auVar185,auVar152);
          auVar186._8_4_ = 0x80000000;
          auVar186._0_8_ = 0x8000000080000000;
          auVar186._12_4_ = 0x80000000;
          auVar152 = vandps_avx(auVar29,auVar186);
          auVar156._0_4_ = auVar127._0_4_ * fVar27;
          auVar156._4_4_ = auVar127._4_4_ * fVar201;
          auVar156._8_4_ = auVar127._8_4_ * fVar203;
          auVar156._12_4_ = auVar127._12_4_ * fVar205;
          auVar127 = vorps_avx(auVar152,auVar156);
          auVar157._0_4_ = auVar156._0_4_ + auVar156._0_4_;
          auVar157._4_4_ = auVar156._4_4_ + auVar156._4_4_;
          auVar157._8_4_ = auVar156._8_4_ + auVar156._8_4_;
          auVar157._12_4_ = auVar156._12_4_ + auVar156._12_4_;
          auVar152 = vorps_avx(auVar152,auVar157);
          auVar29 = vcmpps_avx(auVar29,ZEXT816(0) << 0x40,1);
          auVar29 = vandps_avx(auVar431,auVar29);
          auVar130._0_4_ = auVar29._0_4_ + auVar152._0_4_;
          auVar130._4_4_ = auVar29._4_4_ + auVar152._4_4_;
          auVar130._8_4_ = auVar29._8_4_ + auVar152._8_4_;
          auVar130._12_4_ = auVar29._12_4_ + auVar152._12_4_;
          auVar29 = vsubps_avx(auVar397,auVar127);
          auVar29 = vblendvps_avx(auVar29,auVar130,auVar257);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar27 = acosf(*(float *)(*pauVar23 + lVar20 * 4));
            *(float *)(*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_150._0_8_);
    }
    break;
  case 0xe:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar482._8_4_ = 0xbeaaaa53;
        auVar482._0_8_ = 0xbeaaaa53beaaaa53;
        auVar451._8_4_ = 0xbe117200;
        auVar451._0_8_ = 0xbe117200be117200;
        auVar435._8_4_ = 0xbc83a25c;
        auVar435._0_8_ = 0xbc83a25cbc83a25c;
        auVar377._8_4_ = 0x3f800000;
        auVar377._0_8_ = 0x3f8000003f800000;
        auVar318._8_4_ = 0x80000000;
        auVar318._0_8_ = 0x8000000080000000;
        auVar293._8_4_ = 0xbd99b01e;
        auVar293._0_8_ = 0xbd99b01ebd99b01e;
        auVar192._8_4_ = 0xbf800000;
        auVar192._0_8_ = 0xbf800000bf800000;
        auVar136._8_4_ = 0x7fffffff;
        auVar136._0_8_ = 0x7fffffff7fffffff;
        auVar482._12_4_ = 0xbeaaaa53;
        auVar451._12_4_ = 0xbe117200;
        auVar435._12_4_ = 0xbc83a25c;
        auVar377._12_4_ = 0x3f800000;
        auVar318._12_4_ = 0x80000000;
        auVar293._12_4_ = 0xbd99b01e;
        auVar192._12_4_ = 0xbf800000;
        auVar136._12_4_ = 0x7fffffff;
        auVar482._16_4_ = 0xbeaaaa53;
        auVar451._16_4_ = 0xbe117200;
        auVar435._16_4_ = 0xbc83a25c;
        auVar377._16_4_ = 0x3f800000;
        auVar318._16_4_ = 0x80000000;
        auVar293._16_4_ = 0xbd99b01e;
        auVar192._16_4_ = 0xbf800000;
        auVar136._16_4_ = 0x7fffffff;
        auVar482._20_4_ = 0xbeaaaa53;
        auVar451._20_4_ = 0xbe117200;
        auVar435._20_4_ = 0xbc83a25c;
        auVar377._20_4_ = 0x3f800000;
        auVar318._20_4_ = 0x80000000;
        auVar293._20_4_ = 0xbd99b01e;
        auVar192._20_4_ = 0xbf800000;
        auVar136._20_4_ = 0x7fffffff;
        auVar482._24_4_ = 0xbeaaaa53;
        auVar451._24_4_ = 0xbe117200;
        auVar435._24_4_ = 0xbc83a25c;
        auVar377._24_4_ = 0x3f800000;
        auVar318._24_4_ = 0x80000000;
        auVar293._24_4_ = 0xbd99b01e;
        auVar192._24_4_ = 0xbf800000;
        auVar136._24_4_ = 0x7fffffff;
        auVar482._28_4_ = 0xbeaaaa53;
        auVar451._28_4_ = 0xbe117200;
        auVar435._28_4_ = 0xbc83a25c;
        auVar377._28_4_ = 0x3f800000;
        auVar318._28_4_ = 0x80000000;
        auVar293._28_4_ = 0xbd99b01e;
        auVar192._28_4_ = 0xbf800000;
        auVar136._28_4_ = 0x7fffffff;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar139 = vandps_avx(*pauVar23,auVar136);
            auVar196 = vcmpps_avx(auVar377,auVar139,1);
            auVar51 = vblendvps_avx(auVar139,auVar192,auVar196);
            auVar139 = vmaxps_avx(auVar377,auVar139);
            auVar270 = vrcpps_avx(auVar139);
            auVar272._0_4_ = auVar51._0_4_ * auVar270._0_4_;
            auVar272._4_4_ = auVar51._4_4_ * auVar270._4_4_;
            auVar272._8_4_ = auVar51._8_4_ * auVar270._8_4_;
            auVar272._12_4_ = auVar51._12_4_ * auVar270._12_4_;
            auVar272._16_4_ = auVar51._16_4_ * auVar270._16_4_;
            auVar272._20_4_ = auVar51._20_4_ * auVar270._20_4_;
            auVar272._28_36_ = in_ZMM5._28_36_;
            auVar272._24_4_ = auVar51._24_4_ * auVar270._24_4_;
            auVar29 = vfmsub213ps_fma(auVar139,auVar272._0_32_,auVar51);
            auVar127 = vfnmadd213ps_fma(ZEXT1632(auVar29),auVar270,auVar272._0_32_);
            fVar27 = auVar127._0_4_ * auVar127._0_4_;
            fVar201 = auVar127._4_4_ * auVar127._4_4_;
            fVar203 = auVar127._8_4_ * auVar127._8_4_;
            fVar205 = auVar127._12_4_ * auVar127._12_4_;
            auVar2._28_4_ = auVar51._28_4_;
            auVar2._0_28_ = ZEXT1628(CONCAT412(fVar205,CONCAT48(fVar203,CONCAT44(fVar201,fVar27))));
            auVar3._28_4_ = auVar270._28_4_;
            auVar3._0_28_ =
                 ZEXT1628(CONCAT412(fVar205 * fVar205,
                                    CONCAT48(fVar203 * fVar203,
                                             CONCAT44(fVar201 * fVar201,fVar27 * fVar27))));
            auVar29 = vfmadd213ps_fma(auVar435,auVar3,auVar293);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar3,auVar451);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar3,auVar482);
            in_ZMM5 = ZEXT1664(auVar29);
            auVar294._8_4_ = 0x3b3ac537;
            auVar294._0_8_ = 0x3b3ac5373b3ac537;
            auVar294._12_4_ = 0x3b3ac537;
            auVar294._16_4_ = 0x3b3ac537;
            auVar294._20_4_ = 0x3b3ac537;
            auVar294._24_4_ = 0x3b3ac537;
            auVar294._28_4_ = 0x3b3ac537;
            auVar319._8_4_ = 0x3d2edd4e;
            auVar319._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar319._12_4_ = 0x3d2edd4e;
            auVar319._16_4_ = 0x3d2edd4e;
            auVar319._20_4_ = 0x3d2edd4e;
            auVar319._24_4_ = 0x3d2edd4e;
            auVar319._28_4_ = 0x3d2edd4e;
            auVar152 = vfmadd213ps_fma(auVar294,auVar3,auVar319);
            auVar320._8_4_ = 0x3dd9ed24;
            auVar320._0_8_ = 0x3dd9ed243dd9ed24;
            auVar320._12_4_ = 0x3dd9ed24;
            auVar320._16_4_ = 0x3dd9ed24;
            auVar320._20_4_ = 0x3dd9ed24;
            auVar320._24_4_ = 0x3dd9ed24;
            auVar320._28_4_ = 0x3dd9ed24;
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar3,auVar320);
            auVar321._8_4_ = 0x3e4cb974;
            auVar321._0_8_ = 0x3e4cb9743e4cb974;
            auVar321._12_4_ = 0x3e4cb974;
            auVar321._16_4_ = 0x3e4cb974;
            auVar321._20_4_ = 0x3e4cb974;
            auVar321._24_4_ = 0x3e4cb974;
            auVar321._28_4_ = 0x3e4cb974;
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar3,auVar321);
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar3,auVar377);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar2,ZEXT1632(auVar29));
            auVar193._8_4_ = 0x3fc90fdb;
            auVar193._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar193._12_4_ = 0x3fc90fdb;
            auVar193._16_4_ = 0x3fc90fdb;
            auVar193._20_4_ = 0x3fc90fdb;
            auVar193._24_4_ = 0x3fc90fdb;
            auVar193._28_4_ = 0x3fc90fdb;
            auVar139 = vandps_avx(auVar196,auVar193);
            auVar29 = vfmadd231ps_fma(auVar139,ZEXT1632(auVar127),ZEXT1632(auVar29));
            auVar139 = vandps_avx(auVar318,*pauVar23);
            auVar139 = vorps_avx(auVar139,ZEXT1632(auVar29));
            *pauVar23 = auVar139;
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_150._0_4_;
        }
        auVar354._8_4_ = 0x3f800000;
        auVar354._0_8_ = 0x3f8000003f800000;
        auVar354._12_4_ = 0x3f800000;
        auVar390._8_4_ = 0xbf800000;
        auVar390._0_8_ = 0xbf800000bf800000;
        auVar390._12_4_ = 0xbf800000;
        auVar408._8_4_ = 0xbd99b01e;
        auVar408._0_8_ = 0xbd99b01ebd99b01e;
        auVar408._12_4_ = 0xbd99b01e;
        auVar427._8_4_ = 0xbc83a25c;
        auVar427._0_8_ = 0xbc83a25cbc83a25c;
        auVar427._12_4_ = 0xbc83a25c;
        auVar440._8_4_ = 0xbe117200;
        auVar440._0_8_ = 0xbe117200be117200;
        auVar440._12_4_ = 0xbe117200;
        auVar457._8_4_ = 0xbeaaaa53;
        auVar457._0_8_ = 0xbeaaaa53beaaaa53;
        auVar457._12_4_ = 0xbeaaaa53;
        auVar470._8_4_ = 0x3d2edd4e;
        auVar470._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar470._12_4_ = 0x3d2edd4e;
        auVar336._8_4_ = 0x3b3ac537;
        auVar336._0_8_ = 0x3b3ac5373b3ac537;
        auVar336._12_4_ = 0x3b3ac537;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar116._8_4_ = 0x7fffffff;
          auVar116._0_8_ = 0x7fffffff7fffffff;
          auVar116._12_4_ = 0x7fffffff;
          auVar29 = vandps_avx(*(undefined1 (*) [16])*pauVar23,auVar116);
          auVar127 = vcmpps_avx(auVar354,auVar29,1);
          auVar152 = vblendvps_avx(auVar29,auVar390,auVar127);
          auVar29 = vmaxps_avx(auVar354,auVar29);
          auVar257 = vrcpps_avx(auVar29);
          auVar256._0_4_ = auVar152._0_4_ * auVar257._0_4_;
          auVar256._4_4_ = auVar152._4_4_ * auVar257._4_4_;
          auVar256._8_4_ = auVar152._8_4_ * auVar257._8_4_;
          auVar256._12_4_ = auVar152._12_4_ * auVar257._12_4_;
          auVar29 = vfmsub213ps_fma(auVar29,auVar256,auVar152);
          auVar257 = vfnmadd213ps_fma(auVar29,auVar257,auVar256);
          auVar178._0_4_ = auVar257._0_4_ * auVar257._0_4_;
          auVar178._4_4_ = auVar257._4_4_ * auVar257._4_4_;
          auVar178._8_4_ = auVar257._8_4_ * auVar257._8_4_;
          auVar178._12_4_ = auVar257._12_4_ * auVar257._12_4_;
          auVar212._0_4_ = auVar178._0_4_ * auVar178._0_4_;
          auVar212._4_4_ = auVar178._4_4_ * auVar178._4_4_;
          auVar212._8_4_ = auVar178._8_4_ * auVar178._8_4_;
          auVar212._12_4_ = auVar178._12_4_ * auVar178._12_4_;
          auVar29 = vfmadd213ps_fma(auVar427,auVar212,auVar408);
          auVar29 = vfmadd213ps_fma(auVar29,auVar212,auVar440);
          auVar29 = vfmadd213ps_fma(auVar29,auVar212,auVar457);
          in_ZMM5 = ZEXT1664(auVar29);
          auVar152 = vfmadd213ps_fma(auVar336,auVar212,auVar470);
          auVar303._8_4_ = 0x3dd9ed24;
          auVar303._0_8_ = 0x3dd9ed243dd9ed24;
          auVar303._12_4_ = 0x3dd9ed24;
          auVar152 = vfmadd213ps_fma(auVar152,auVar212,auVar303);
          auVar304._8_4_ = 0x3e4cb974;
          auVar304._0_8_ = 0x3e4cb9743e4cb974;
          auVar304._12_4_ = 0x3e4cb974;
          auVar152 = vfmadd213ps_fma(auVar152,auVar212,auVar304);
          auVar152 = vfmadd213ps_fma(auVar152,auVar212,auVar354);
          auVar152 = vfmadd231ps_fma(auVar152,auVar178,auVar29);
          auVar179._8_4_ = 0x3fc90fdb;
          auVar179._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar179._12_4_ = 0x3fc90fdb;
          auVar29 = vandps_avx(auVar127,auVar179);
          auVar152 = vfmadd231ps_fma(auVar29,auVar257,auVar152);
          auVar117._8_4_ = 0x80000000;
          auVar117._0_8_ = 0x8000000080000000;
          auVar117._12_4_ = 0x80000000;
          auVar29 = vandps_avx(*(undefined1 (*) [16])*pauVar23,auVar117);
          auVar29 = vorps_avx(auVar29,auVar152);
          *(undefined1 (*) [16])*pauVar23 = auVar29;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            fVar27 = atanf(*(float *)(*pauVar23 + lVar20 * 4));
            *(float *)(*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0xf:
    iVar26 = bottom_top_blob->c;
    if (0 < (long)iVar26) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar22 = 0;
      auVar59._8_4_ = 0x3f800000;
      auVar59._0_8_ = 0x3f8000003f800000;
      auVar59._12_4_ = 0x3f800000;
      auVar59._16_4_ = 0x3f800000;
      auVar59._20_4_ = 0x3f800000;
      auVar59._24_4_ = 0x3f800000;
      auVar59._28_4_ = 0x3f800000;
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = 0x3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar220._8_8_ = 0x8000000000000000;
      auVar220._0_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx(auVar152,auVar152);
      do {
        pauVar23 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar16 = 7;
          do {
            auVar196 = vrcpps_avx(*pauVar23);
            auVar152 = vfmsub213ps_fma(*pauVar23,auVar196,auVar59);
            auVar152 = vfnmadd132ps_fma(ZEXT1632(auVar152),auVar196,auVar196);
            *pauVar23 = ZEXT1632(auVar152);
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
            uVar19 = uVar24 & 0xfffffff8;
          } while (iVar16 < (int)uVar24);
        }
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar152 = vrcpps_avx(*(undefined1 (*) [16])*pauVar23);
          auVar127 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar23,auVar152,auVar125);
          auVar152 = vfnmadd132ps_fma(auVar127,auVar152,auVar152);
          *(undefined1 (*) [16])*pauVar23 = auVar152;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar24) {
          uVar17 = CONCAT44(0,~uVar19 + uVar24);
          auVar281._8_8_ = 0;
          auVar281._0_8_ = uVar17;
          auVar257 = vpshufd_avx(auVar281,0x44);
          auVar152 = vorps_avx(auVar257,auVar220);
          auVar127 = vorps_avx(auVar257,auVar220);
          auVar257 = vorps_avx(auVar257,auVar220);
          uVar25 = 0;
          do {
            auVar361._8_8_ = 0;
            auVar361._0_8_ = uVar25;
            auVar342 = vpshufd_avx(auVar361,0x44);
            auVar379._16_16_ = auVar342;
            auVar379._0_16_ = auVar342;
            auVar196 = vorps_avx(auVar379,auVar139);
            auVar270 = vorps_avx(auVar379,auVar51);
            auVar411._0_8_ = auVar270._16_8_ ^ 0x8000000000000000;
            auVar411._8_4_ = auVar270._24_4_;
            auVar411._12_4_ = auVar270._28_4_ ^ 0x80000000;
            auVar342 = vpcmpgtq_avx(auVar411,auVar152);
            auVar362._0_8_ = auVar270._0_8_ ^ 0x8000000000000000;
            auVar362._8_4_ = auVar270._8_4_;
            auVar362._12_4_ = auVar270._12_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar362,auVar127);
            auVar342 = vpackssdw_avx(auVar368,auVar342);
            auVar412._0_8_ = auVar196._16_8_ ^ 0x8000000000000000;
            auVar412._8_4_ = auVar196._24_4_;
            auVar412._12_4_ = auVar196._28_4_ ^ 0x80000000;
            auVar368 = vpcmpgtq_avx(auVar412,auVar152);
            auVar393._0_8_ = auVar196._0_8_ ^ 0x8000000000000000;
            auVar393._8_4_ = auVar196._8_4_;
            auVar393._12_4_ = auVar196._12_4_ ^ 0x80000000;
            auVar416 = vpcmpgtq_avx(auVar393,auVar257);
            auVar368 = vpackssdw_avx(auVar416,auVar368);
            auVar342 = vpackssdw_avx(auVar368 ^ auVar29,auVar342 ^ auVar29);
            auVar368 = vpmovsxwd_avx(auVar342);
            auVar342 = vpunpckhwd_avx(auVar342,auVar342);
            auVar380._16_16_ = auVar342;
            auVar380._0_16_ = auVar368;
            auVar270 = vmaskmovps_avx(auVar380,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            auVar196 = vrcpps_avx(auVar270);
            auVar342 = vfmsub213ps_fma(auVar270,auVar196,auVar59);
            auVar342 = vfnmadd132ps_fma(ZEXT1632(auVar342),auVar196,auVar196);
            auVar196 = vmaskmovps_avx(auVar380,ZEXT1632(auVar342));
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar196;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != iVar26);
    }
    break;
  case 0x10:
    local_120._0_8_ = (long)bottom_top_blob->c;
    if (0 < (long)bottom_top_blob->c) {
      uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_150._0_4_ = uVar24 & 0xfffffff8;
      lVar22 = 0;
      do {
        auVar434._8_4_ = 0x395e8083;
        auVar434._0_8_ = 0x395e8083395e8083;
        auVar399._8_4_ = 0x3f318000;
        auVar399._0_8_ = 0x3f3180003f318000;
        auVar376._8_4_ = 0x3f800000;
        auVar376._0_8_ = 0x3f8000003f800000;
        auVar317._8_4_ = 0x3f000000;
        auVar317._0_8_ = 0x3f0000003f000000;
        auVar292._8_4_ = 0x3d2aa9c1;
        auVar292._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar268._8_4_ = 0x3c088908;
        auVar268._0_8_ = 0x3c0889083c088908;
        auVar240._8_4_ = 0xc0000000;
        auVar240._0_8_ = 0xc0000000c0000000;
        auVar191._8_4_ = 0x3fb8aa3b;
        auVar191._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar164._8_4_ = 0xc2b0c0a5;
        auVar164._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar134._8_4_ = 0x42b0c0a5;
        auVar134._0_8_ = 0x42b0c0a542b0c0a5;
        auVar50._8_4_ = 0x39506967;
        auVar50._0_8_ = 0x3950696739506967;
        auVar434._12_4_ = 0x395e8083;
        auVar399._12_4_ = 0x3f318000;
        auVar376._12_4_ = 0x3f800000;
        auVar317._12_4_ = 0x3f000000;
        auVar292._12_4_ = 0x3d2aa9c1;
        auVar268._12_4_ = 0x3c088908;
        auVar240._12_4_ = 0xc0000000;
        auVar191._12_4_ = 0x3fb8aa3b;
        auVar164._12_4_ = 0xc2b0c0a5;
        auVar134._12_4_ = 0x42b0c0a5;
        auVar50._12_4_ = 0x39506967;
        auVar434._16_4_ = 0x395e8083;
        auVar399._16_4_ = 0x3f318000;
        auVar376._16_4_ = 0x3f800000;
        auVar317._16_4_ = 0x3f000000;
        auVar292._16_4_ = 0x3d2aa9c1;
        auVar268._16_4_ = 0x3c088908;
        auVar240._16_4_ = 0xc0000000;
        auVar191._16_4_ = 0x3fb8aa3b;
        auVar164._16_4_ = 0xc2b0c0a5;
        auVar134._16_4_ = 0x42b0c0a5;
        auVar50._16_4_ = 0x39506967;
        auVar434._20_4_ = 0x395e8083;
        auVar399._20_4_ = 0x3f318000;
        auVar376._20_4_ = 0x3f800000;
        auVar317._20_4_ = 0x3f000000;
        auVar292._20_4_ = 0x3d2aa9c1;
        auVar268._20_4_ = 0x3c088908;
        auVar240._20_4_ = 0xc0000000;
        auVar191._20_4_ = 0x3fb8aa3b;
        auVar164._20_4_ = 0xc2b0c0a5;
        auVar134._20_4_ = 0x42b0c0a5;
        auVar50._20_4_ = 0x39506967;
        auVar434._24_4_ = 0x395e8083;
        auVar399._24_4_ = 0x3f318000;
        auVar376._24_4_ = 0x3f800000;
        auVar317._24_4_ = 0x3f000000;
        auVar292._24_4_ = 0x3d2aa9c1;
        auVar268._24_4_ = 0x3c088908;
        auVar240._24_4_ = 0xc0000000;
        auVar191._24_4_ = 0x3fb8aa3b;
        auVar164._24_4_ = 0xc2b0c0a5;
        auVar134._24_4_ = 0x42b0c0a5;
        auVar50._24_4_ = 0x39506967;
        auVar434._28_4_ = 0x395e8083;
        auVar399._28_4_ = 0x3f318000;
        auVar376._28_4_ = 0x3f800000;
        auVar317._28_4_ = 0x3f000000;
        auVar292._28_4_ = 0x3d2aa9c1;
        auVar268._28_4_ = 0x3c088908;
        auVar240._28_4_ = 0xc0000000;
        auVar191._28_4_ = 0x3fb8aa3b;
        auVar164._28_4_ = 0xc2b0c0a5;
        auVar134._28_4_ = 0x42b0c0a5;
        auVar50._28_4_ = 0x39506967;
        auVar74 = ZEXT3264(auVar50);
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if ((int)uVar24 < 8) {
          uVar19 = 0;
        }
        else {
          iVar26 = 7;
          do {
            auVar75._0_4_ = *(float *)*pauVar23 * -2.0;
            auVar75._4_4_ = *(float *)((long)*pauVar23 + 4) * -2.0;
            auVar75._8_4_ = *(float *)((long)*pauVar23 + 8) * -2.0;
            auVar75._12_4_ = *(float *)((long)*pauVar23 + 0xc) * -2.0;
            auVar75._16_4_ = *(float *)((long)*pauVar23 + 0x10) * -2.0;
            auVar75._20_4_ = *(float *)((long)*pauVar23 + 0x14) * -2.0;
            auVar75._28_36_ = auVar74._28_36_;
            auVar75._24_4_ = *(float *)((long)*pauVar23 + 0x18) * -2.0;
            auVar139 = vminps_avx(auVar75._0_32_,auVar134);
            auVar51 = vmaxps_avx(auVar139,auVar164);
            auVar29 = vfmadd213ps_fma(auVar191,auVar51,auVar317);
            auVar196 = vroundps_avx(ZEXT1632(auVar29),1);
            auVar139 = vcmpps_avx(ZEXT1632(auVar29),auVar196,1);
            auVar139 = vandps_avx(auVar376,auVar139);
            auVar139 = vsubps_avx(auVar196,auVar139);
            auVar29 = vfmsub231ps_fma(auVar51,auVar139,auVar399);
            auVar152 = vfmsub231ps_fma(ZEXT1632(auVar29),auVar139,auVar434);
            auVar51 = ZEXT1632(auVar152);
            auVar1._28_4_ = auVar196._28_4_;
            auVar1._0_28_ =
                 ZEXT1628(CONCAT412(auVar152._12_4_ * auVar152._12_4_,
                                    CONCAT48(auVar152._8_4_ * auVar152._8_4_,
                                             CONCAT44(auVar152._4_4_ * auVar152._4_4_,
                                                      auVar152._0_4_ * auVar152._0_4_))));
            auVar449._8_4_ = 0x3ab743ce;
            auVar449._0_8_ = 0x3ab743ce3ab743ce;
            auVar449._12_4_ = 0x3ab743ce;
            auVar449._16_4_ = 0x3ab743ce;
            auVar449._20_4_ = 0x3ab743ce;
            auVar449._24_4_ = 0x3ab743ce;
            auVar449._28_4_ = 0x3ab743ce;
            auVar29 = vfmadd213ps_fma(auVar50,auVar51,auVar449);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar268);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar292);
            auVar450._8_4_ = 0x3e2aaaaa;
            auVar450._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar450._12_4_ = 0x3e2aaaaa;
            auVar450._16_4_ = 0x3e2aaaaa;
            auVar450._20_4_ = 0x3e2aaaaa;
            auVar450._24_4_ = 0x3e2aaaaa;
            auVar450._28_4_ = 0x3e2aaaaa;
            auVar51 = ZEXT1632(auVar152);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar450);
            auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar51,auVar317);
            auVar127 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar1,auVar51);
            auVar28._0_4_ = (int)auVar139._0_4_;
            auVar28._4_4_ = (int)auVar139._4_4_;
            auVar28._8_4_ = (int)auVar139._8_4_;
            auVar28._12_4_ = (int)auVar139._12_4_;
            auVar52._16_4_ = (int)auVar139._16_4_;
            auVar52._0_16_ = auVar28;
            auVar52._20_4_ = (int)auVar139._20_4_;
            auVar52._24_4_ = (int)auVar139._24_4_;
            auVar52._28_4_ = (int)auVar139._28_4_;
            auVar152 = vpslld_avx(auVar28,0x17);
            auVar29 = vpslld_avx(auVar52._16_16_,0x17);
            auVar334._8_4_ = 0x3f800000;
            auVar334._0_8_ = 0x3f8000003f800000;
            auVar334._12_4_ = 0x3f800000;
            auVar29 = vpaddd_avx(auVar334,auVar29);
            auVar152 = vpaddd_avx(auVar334,auVar152);
            auVar53._16_16_ = auVar29;
            auVar53._0_16_ = auVar152;
            auVar135._0_4_ = auVar127._0_4_ + 1.0;
            auVar135._4_4_ = auVar127._4_4_ + 1.0;
            auVar135._8_4_ = auVar127._8_4_ + 1.0;
            auVar135._12_4_ = auVar127._12_4_ + 1.0;
            auVar135._16_4_ = 0x3f800000;
            auVar135._20_4_ = 0x3f800000;
            auVar135._24_4_ = 0x3f800000;
            auVar135._28_4_ = 0x3f800000;
            auVar29 = vfmadd213ps_fma(auVar53,auVar135,auVar376);
            auVar139 = vrcpps_avx(ZEXT1632(auVar29));
            auVar29 = vfmsub213ps_fma(ZEXT1632(auVar29),auVar139,auVar376);
            auVar29 = vfnmadd132ps_fma(ZEXT1632(auVar29),auVar139,auVar139);
            auVar29 = vfnmsub213ps_fma(ZEXT1632(auVar29),auVar240,auVar376);
            auVar74 = ZEXT1664(auVar29);
            *pauVar23 = ZEXT1632(auVar29);
            pauVar23 = pauVar23 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar24);
          uVar19 = local_150._0_4_;
        }
        auVar211._8_4_ = 0x3f800000;
        auVar211._0_8_ = 0x3f8000003f800000;
        auVar211._12_4_ = 0x3f800000;
        auVar302._8_4_ = 0xc2b0c0a5;
        auVar302._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar302._12_4_ = 0xc2b0c0a5;
        auVar335._8_4_ = 0x3fb8aa3b;
        auVar335._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar335._12_4_ = 0x3fb8aa3b;
        auVar353._8_4_ = 0x3f000000;
        auVar353._0_8_ = 0x3f0000003f000000;
        auVar353._12_4_ = 0x3f000000;
        auVar389._8_4_ = 0x3f318000;
        auVar389._0_8_ = 0x3f3180003f318000;
        auVar389._12_4_ = 0x3f318000;
        auVar407._8_4_ = 0x395e8083;
        auVar407._0_8_ = 0x395e8083395e8083;
        auVar407._12_4_ = 0x395e8083;
        auVar426._8_4_ = 0x3ab743ce;
        auVar426._0_8_ = 0x3ab743ce3ab743ce;
        auVar426._12_4_ = 0x3ab743ce;
        auVar439._8_4_ = 0x39506967;
        auVar439._0_8_ = 0x3950696739506967;
        auVar439._12_4_ = 0x39506967;
        auVar456._8_4_ = 0x3c088908;
        auVar456._0_8_ = 0x3c0889083c088908;
        auVar456._12_4_ = 0x3c088908;
        auVar469._8_4_ = 0x3d2aa9c1;
        auVar469._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar469._12_4_ = 0x3d2aa9c1;
        uVar18 = uVar19 | 3;
        while ((int)uVar18 < (int)uVar24) {
          auVar30._0_4_ = *(float *)*pauVar23 * -2.0;
          auVar30._4_4_ = *(float *)((long)*pauVar23 + 4) * -2.0;
          auVar30._8_4_ = *(float *)((long)*pauVar23 + 8) * -2.0;
          auVar30._12_4_ = *(float *)((long)*pauVar23 + 0xc) * -2.0;
          auVar114._8_4_ = 0x42b0c0a5;
          auVar114._0_8_ = 0x42b0c0a542b0c0a5;
          auVar114._12_4_ = 0x42b0c0a5;
          auVar29 = vminps_avx(auVar30,auVar114);
          auVar127 = vmaxps_avx(auVar29,auVar302);
          auVar29 = vfmadd213ps_fma(auVar335,auVar127,auVar353);
          auVar143._0_4_ = (int)auVar29._0_4_;
          auVar143._4_4_ = (int)auVar29._4_4_;
          auVar143._8_4_ = (int)auVar29._8_4_;
          auVar143._12_4_ = (int)auVar29._12_4_;
          auVar152 = vcvtdq2ps_avx(auVar143);
          auVar29 = vcmpps_avx(auVar29,auVar152,1);
          auVar29 = vandps_avx(auVar29,auVar211);
          auVar29 = vsubps_avx(auVar152,auVar29);
          auVar152 = vfmsub231ps_fma(auVar127,auVar29,auVar389);
          auVar127 = vfmsub231ps_fma(auVar152,auVar29,auVar407);
          auVar144._0_4_ = auVar127._0_4_ * auVar127._0_4_;
          auVar144._4_4_ = auVar127._4_4_ * auVar127._4_4_;
          auVar144._8_4_ = auVar127._8_4_ * auVar127._8_4_;
          auVar144._12_4_ = auVar127._12_4_ * auVar127._12_4_;
          auVar152 = vfmadd213ps_fma(auVar439,auVar127,auVar426);
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar456);
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar469);
          auVar276._8_4_ = 0x3e2aaaaa;
          auVar276._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar276._12_4_ = 0x3e2aaaaa;
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar276);
          auVar152 = vfmadd213ps_fma(auVar152,auVar127,auVar353);
          auVar152 = vfmadd213ps_fma(auVar152,auVar144,auVar127);
          auVar31._0_4_ = auVar152._0_4_ + 1.0;
          auVar31._4_4_ = auVar152._4_4_ + 1.0;
          auVar31._8_4_ = auVar152._8_4_ + 1.0;
          auVar31._12_4_ = auVar152._12_4_ + 1.0;
          auVar115._0_4_ = (int)auVar29._0_4_;
          auVar115._4_4_ = (int)auVar29._4_4_;
          auVar115._8_4_ = (int)auVar29._8_4_;
          auVar115._12_4_ = (int)auVar29._12_4_;
          auVar29 = vpslld_avx(auVar115,0x17);
          auVar29 = vpaddd_avx(auVar29,auVar211);
          auVar152 = vfmadd213ps_fma(auVar29,auVar31,auVar211);
          auVar29 = vrcpps_avx(auVar152);
          auVar145._0_4_ = auVar29._0_4_ + auVar29._0_4_;
          auVar145._4_4_ = auVar29._4_4_ + auVar29._4_4_;
          auVar145._8_4_ = auVar29._8_4_ + auVar29._8_4_;
          auVar145._12_4_ = auVar29._12_4_ + auVar29._12_4_;
          auVar177._8_4_ = 0x40000000;
          auVar177._0_8_ = 0x4000000040000000;
          auVar177._12_4_ = 0x40000000;
          auVar152 = vfmsub213ps_fma(auVar152,auVar145,auVar177);
          auVar29 = vfnmadd213ps_fma(auVar152,auVar29,auVar145);
          *(float *)*pauVar23 = auVar29._0_4_ + -1.0;
          *(float *)((long)*pauVar23 + 4) = auVar29._4_4_ + -1.0;
          *(float *)((long)*pauVar23 + 8) = auVar29._8_4_ + -1.0;
          *(float *)((long)*pauVar23 + 0xc) = auVar29._12_4_ + -1.0;
          pauVar23 = (undefined1 (*) [32])((long)*pauVar23 + 0x10);
          uVar18 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if (uVar24 - uVar19 != 0 && (int)uVar19 <= (int)uVar24) {
          lVar20 = 0;
          do {
            fVar27 = tanhf(*(float *)((long)*pauVar23 + lVar20 * 4));
            *(float *)((long)*pauVar23 + lVar20 * 4) = fVar27;
            lVar20 = lVar20 + 1;
          } while (uVar24 - uVar19 != (int)lVar20);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_120._0_8_);
    }
    break;
  case 0x11:
    local_138 = (long)bottom_top_blob->c;
    if (0 < local_138) {
      iVar26 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      local_130 = CONCAT44(local_130._4_4_,iVar26) & 0xfffffffffffffff8;
      lVar22 = 0;
      local_f0._8_8_ = 0x8000000000000000;
      local_f0._0_8_ = 0x8000000000000000;
      do {
        auVar484._8_4_ = 0xbe2aae50;
        auVar484._0_8_ = 0xbe2aae50be2aae50;
        auVar465._8_4_ = 0xbdfe5d4f;
        auVar465._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar423._8_4_ = 0x3d9021bb;
        auVar423._0_8_ = 0x3d9021bb3d9021bb;
        auVar349._8_4_ = 0x3f3504f3;
        auVar349._0_8_ = 0x3f3504f33f3504f3;
        auVar330._8_4_ = 0x3f000000;
        auVar330._0_8_ = 0x3f0000003f000000;
        auVar270._8_4_ = 0x3def251a;
        auVar270._0_8_ = 0x3def251a3def251a;
        auVar196._8_4_ = 0x807fffff;
        auVar196._0_8_ = 0x807fffff807fffff;
        auVar51._8_4_ = 0xbdebd1b8;
        auVar51._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar139._8_4_ = 0x800000;
        auVar139._0_8_ = 0x80000000800000;
        auVar484._12_4_ = 0xbe2aae50;
        auVar465._12_4_ = 0xbdfe5d4f;
        auVar423._12_4_ = 0x3d9021bb;
        auVar349._12_4_ = 0x3f3504f3;
        auVar330._12_4_ = 0x3f000000;
        auVar270._12_4_ = 0x3def251a;
        auVar196._12_4_ = 0x807fffff;
        auVar51._12_4_ = 0xbdebd1b8;
        auVar139._12_4_ = 0x800000;
        auVar484._16_4_ = 0xbe2aae50;
        auVar465._16_4_ = 0xbdfe5d4f;
        auVar423._16_4_ = 0x3d9021bb;
        auVar349._16_4_ = 0x3f3504f3;
        auVar330._16_4_ = 0x3f000000;
        auVar270._16_4_ = 0x3def251a;
        auVar196._16_4_ = 0x807fffff;
        auVar51._16_4_ = 0xbdebd1b8;
        auVar139._16_4_ = 0x800000;
        auVar484._20_4_ = 0xbe2aae50;
        auVar465._20_4_ = 0xbdfe5d4f;
        auVar423._20_4_ = 0x3d9021bb;
        auVar349._20_4_ = 0x3f3504f3;
        auVar330._20_4_ = 0x3f000000;
        auVar270._20_4_ = 0x3def251a;
        auVar196._20_4_ = 0x807fffff;
        auVar51._20_4_ = 0xbdebd1b8;
        auVar139._20_4_ = 0x800000;
        auVar484._24_4_ = 0xbe2aae50;
        auVar465._24_4_ = 0xbdfe5d4f;
        auVar423._24_4_ = 0x3d9021bb;
        auVar349._24_4_ = 0x3f3504f3;
        auVar330._24_4_ = 0x3f000000;
        auVar270._24_4_ = 0x3def251a;
        auVar196._24_4_ = 0x807fffff;
        auVar51._24_4_ = 0xbdebd1b8;
        auVar139._24_4_ = 0x800000;
        auVar484._28_4_ = 0xbe2aae50;
        auVar465._28_4_ = 0xbdfe5d4f;
        auVar423._28_4_ = 0x3d9021bb;
        auVar349._28_4_ = 0x3f3504f3;
        auVar330._28_4_ = 0x3f000000;
        auVar270._28_4_ = 0x3def251a;
        auVar196._28_4_ = 0x807fffff;
        auVar51._28_4_ = 0xbdebd1b8;
        auVar139._28_4_ = 0x800000;
        pauVar23 = (undefined1 (*) [32])
                   (local_128->cstep * lVar22 * local_128->elemsize + (long)local_128->data);
        if (iVar26 < 8) {
          uVar24 = 0;
        }
        else {
          iVar16 = 7;
          auVar29._8_4_ = 0xffffff81;
          auVar29._0_8_ = 0xffffff81ffffff81;
          auVar29._12_4_ = 0xffffff81;
          do {
            auVar65 = vmaxps_avx(auVar139,*pauVar23);
            auVar127 = vpsrld_avx(auVar65._0_16_,0x17);
            auVar152 = vpsrld_avx(auVar65._16_16_,0x17);
            auVar65 = vandps_avx(auVar65,auVar196);
            auVar166 = vorps_avx(auVar65,auVar330);
            auVar140 = vcmpps_avx(auVar349,auVar166,2);
            auVar65 = vandnps_avx(auVar140,auVar166);
            auVar64._0_4_ = auVar166._0_4_ + -1.0 + auVar65._0_4_;
            auVar64._4_4_ = auVar166._4_4_ + -1.0 + auVar65._4_4_;
            auVar64._8_4_ = auVar166._8_4_ + -1.0 + auVar65._8_4_;
            auVar64._12_4_ = auVar166._12_4_ + -1.0 + auVar65._12_4_;
            auVar64._16_4_ = auVar166._16_4_ + -1.0 + auVar65._16_4_;
            auVar64._20_4_ = auVar166._20_4_ + -1.0 + auVar65._20_4_;
            auVar64._24_4_ = auVar166._24_4_ + -1.0 + auVar65._24_4_;
            auVar64._28_4_ = auVar166._28_4_ + -1.0 + auVar65._28_4_;
            auVar152 = vpsubd_avx(auVar152,auVar140._16_16_);
            auVar152 = vpaddd_avx(auVar152,auVar29);
            auVar127 = vpsubd_avx(auVar127,auVar140._0_16_);
            auVar127 = vpaddd_avx(auVar127,auVar29);
            auVar140._16_16_ = auVar152;
            auVar140._0_16_ = auVar127;
            auVar166._0_4_ = auVar64._0_4_ * auVar64._0_4_;
            auVar166._4_4_ = auVar64._4_4_ * auVar64._4_4_;
            auVar166._8_4_ = auVar64._8_4_ * auVar64._8_4_;
            auVar166._12_4_ = auVar64._12_4_ * auVar64._12_4_;
            auVar166._16_4_ = auVar64._16_4_ * auVar64._16_4_;
            auVar166._20_4_ = auVar64._20_4_ * auVar64._20_4_;
            auVar166._24_4_ = auVar64._24_4_ * auVar64._24_4_;
            auVar166._28_4_ = 0;
            auVar152 = vfmadd213ps_fma(auVar423,auVar64,auVar51);
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar64,auVar270);
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar64,auVar465);
            auVar243._8_4_ = 0x3e11e9bf;
            auVar243._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar243._12_4_ = 0x3e11e9bf;
            auVar243._16_4_ = 0x3e11e9bf;
            auVar243._20_4_ = 0x3e11e9bf;
            auVar243._24_4_ = 0x3e11e9bf;
            auVar243._28_4_ = 0x3e11e9bf;
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar64,auVar243);
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar64,auVar484);
            auVar244._8_4_ = 0x3e4cceac;
            auVar244._0_8_ = 0x3e4cceac3e4cceac;
            auVar244._12_4_ = 0x3e4cceac;
            auVar244._16_4_ = 0x3e4cceac;
            auVar244._20_4_ = 0x3e4cceac;
            auVar244._24_4_ = 0x3e4cceac;
            auVar244._28_4_ = 0x3e4cceac;
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar64,auVar244);
            auVar245._8_4_ = 0xbe7ffffc;
            auVar245._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar245._12_4_ = 0xbe7ffffc;
            auVar245._16_4_ = 0xbe7ffffc;
            auVar245._20_4_ = 0xbe7ffffc;
            auVar245._24_4_ = 0xbe7ffffc;
            auVar245._28_4_ = 0xbe7ffffc;
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar64,auVar245);
            auVar246._8_4_ = 0x3eaaaaaa;
            auVar246._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar246._12_4_ = 0x3eaaaaaa;
            auVar246._16_4_ = 0x3eaaaaaa;
            auVar246._20_4_ = 0x3eaaaaaa;
            auVar246._24_4_ = 0x3eaaaaaa;
            auVar246._28_4_ = 0x3eaaaaaa;
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),auVar64,auVar246);
            auVar197._0_4_ = auVar166._0_4_ * auVar64._0_4_ * auVar152._0_4_;
            auVar197._4_4_ = auVar166._4_4_ * auVar64._4_4_ * auVar152._4_4_;
            auVar197._8_4_ = auVar166._8_4_ * auVar64._8_4_ * auVar152._8_4_;
            auVar197._12_4_ = auVar166._12_4_ * auVar64._12_4_ * auVar152._12_4_;
            auVar197._16_4_ = auVar166._16_4_ * auVar64._16_4_ * 0.0;
            auVar197._20_4_ = auVar166._20_4_ * auVar64._20_4_ * 0.0;
            auVar197._24_4_ = auVar166._24_4_ * auVar64._24_4_ * 0.0;
            auVar197._28_4_ = 0;
            auVar65 = vcvtdq2ps_avx(auVar140);
            auVar247._8_4_ = 0xb95e8083;
            auVar247._0_8_ = 0xb95e8083b95e8083;
            auVar247._12_4_ = 0xb95e8083;
            auVar247._16_4_ = 0xb95e8083;
            auVar247._20_4_ = 0xb95e8083;
            auVar247._24_4_ = 0xb95e8083;
            auVar247._28_4_ = 0xb95e8083;
            auVar152 = vfmadd231ps_fma(auVar197,auVar65,auVar247);
            auVar152 = vfmsub231ps_fma(ZEXT1632(auVar152),auVar330,auVar166);
            auVar140 = vsubps_avx(ZEXT1632(auVar152),auVar64);
            auVar167._8_4_ = 0x3f318000;
            auVar167._0_8_ = 0x3f3180003f318000;
            auVar167._12_4_ = 0x3f318000;
            auVar167._16_4_ = 0x3f318000;
            auVar167._20_4_ = 0x3f318000;
            auVar167._24_4_ = 0x3f318000;
            auVar167._28_4_ = 0x3f318000;
            auVar152 = vfnmadd231ps_fma(auVar140,auVar167,auVar65);
            auVar65._0_4_ = auVar152._0_4_ * -0.4342945;
            auVar65._4_4_ = auVar152._4_4_ * -0.4342945;
            auVar65._8_4_ = auVar152._8_4_ * -0.4342945;
            auVar65._12_4_ = auVar152._12_4_ * -0.4342945;
            auVar65._16_4_ = 0x80000000;
            auVar65._20_4_ = 0x80000000;
            auVar65._24_4_ = 0x80000000;
            auVar65._28_4_ = 0;
            *pauVar23 = auVar65;
            pauVar23 = pauVar23 + 1;
            iVar16 = iVar16 + 8;
          } while (iVar16 < iVar26);
          uVar24 = (uint)local_130;
        }
        auVar152._8_4_ = 0x800000;
        auVar152._0_8_ = 0x80000000800000;
        auVar152._12_4_ = 0x800000;
        auVar257._8_4_ = 0x3f000000;
        auVar257._0_8_ = 0x3f0000003f000000;
        auVar257._12_4_ = 0x3f000000;
        auVar342._8_4_ = 0xffffff82;
        auVar342._0_8_ = 0xffffff82ffffff82;
        auVar342._12_4_ = 0xffffff82;
        auVar368._8_4_ = 0x3f3504f3;
        auVar368._0_8_ = 0x3f3504f33f3504f3;
        auVar368._12_4_ = 0x3f3504f3;
        auVar416._8_4_ = 0x3f800000;
        auVar416._0_8_ = 0x3f8000003f800000;
        auVar416._12_4_ = 0x3f800000;
        auVar429._8_4_ = 0xbdebd1b8;
        auVar429._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar429._12_4_ = 0xbdebd1b8;
        auVar444._8_4_ = 0x3d9021bb;
        auVar444._0_8_ = 0x3d9021bb3d9021bb;
        auVar444._12_4_ = 0x3d9021bb;
        auVar461._8_4_ = 0x3def251a;
        auVar461._0_8_ = 0x3def251a3def251a;
        auVar461._12_4_ = 0x3def251a;
        auVar474._8_4_ = 0xbdfe5d4f;
        auVar474._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar474._12_4_ = 0xbdfe5d4f;
        auVar127._8_4_ = 0x3e11e9bf;
        auVar127._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar127._12_4_ = 0x3e11e9bf;
        uVar19 = uVar24 | 3;
        while ((int)uVar19 < iVar26) {
          auVar29 = vmaxps_avx(auVar152,*(undefined1 (*) [16])*pauVar23);
          auVar128 = vpsrld_avx(auVar29,0x17);
          auVar128 = vpaddd_avx(auVar342,auVar128);
          auVar153._8_4_ = 0x807fffff;
          auVar153._0_8_ = 0x807fffff807fffff;
          auVar153._12_4_ = 0x807fffff;
          auVar29 = vandps_avx(auVar29,auVar153);
          auVar154 = vorps_avx(auVar29,auVar257);
          auVar153 = vcvtdq2ps_avx(auVar128);
          auVar128 = vcmpps_avx(auVar154,auVar368,1);
          auVar29 = vandps_avx(auVar128,auVar154);
          auVar40._0_4_ = auVar154._0_4_ + -1.0 + auVar29._0_4_;
          auVar40._4_4_ = auVar154._4_4_ + -1.0 + auVar29._4_4_;
          auVar40._8_4_ = auVar154._8_4_ + -1.0 + auVar29._8_4_;
          auVar40._12_4_ = auVar154._12_4_ + -1.0 + auVar29._12_4_;
          auVar29 = vandps_avx(auVar416,auVar128);
          auVar29 = vsubps_avx(auVar153,auVar29);
          auVar154._0_4_ = auVar40._0_4_ * auVar40._0_4_;
          auVar154._4_4_ = auVar40._4_4_ * auVar40._4_4_;
          auVar154._8_4_ = auVar40._8_4_ * auVar40._8_4_;
          auVar154._12_4_ = auVar40._12_4_ * auVar40._12_4_;
          auVar128 = vfmadd213ps_fma(auVar444,auVar40,auVar429);
          auVar128 = vfmadd213ps_fma(auVar128,auVar40,auVar461);
          auVar128 = vfmadd213ps_fma(auVar128,auVar40,auVar474);
          auVar128 = vfmadd213ps_fma(auVar128,auVar40,auVar127);
          auVar225._8_4_ = 0xbe2aae50;
          auVar225._0_8_ = 0xbe2aae50be2aae50;
          auVar225._12_4_ = 0xbe2aae50;
          auVar128 = vfmadd213ps_fma(auVar128,auVar40,auVar225);
          auVar226._8_4_ = 0x3e4cceac;
          auVar226._0_8_ = 0x3e4cceac3e4cceac;
          auVar226._12_4_ = 0x3e4cceac;
          auVar128 = vfmadd213ps_fma(auVar128,auVar40,auVar226);
          auVar227._8_4_ = 0xbe7ffffc;
          auVar227._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar227._12_4_ = 0xbe7ffffc;
          auVar128 = vfmadd213ps_fma(auVar128,auVar40,auVar227);
          auVar228._8_4_ = 0x3eaaaaaa;
          auVar228._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar228._12_4_ = 0x3eaaaaaa;
          auVar128 = vfmadd213ps_fma(auVar128,auVar40,auVar228);
          auVar184._0_4_ = auVar154._0_4_ * auVar40._0_4_ * auVar128._0_4_;
          auVar184._4_4_ = auVar154._4_4_ * auVar40._4_4_ * auVar128._4_4_;
          auVar184._8_4_ = auVar154._8_4_ * auVar40._8_4_ * auVar128._8_4_;
          auVar184._12_4_ = auVar154._12_4_ * auVar40._12_4_ * auVar128._12_4_;
          auVar128._8_4_ = 0xb95e8083;
          auVar128._0_8_ = 0xb95e8083b95e8083;
          auVar128._12_4_ = 0xb95e8083;
          auVar128 = vfmadd231ps_fma(auVar184,auVar29,auVar128);
          auVar128 = vfmsub231ps_fma(auVar128,auVar257,auVar154);
          auVar128 = vsubps_avx(auVar128,auVar40);
          auVar155._8_4_ = 0x3f318000;
          auVar155._0_8_ = 0x3f3180003f318000;
          auVar155._12_4_ = 0x3f318000;
          auVar29 = vfnmadd231ps_fma(auVar128,auVar155,auVar29);
          *(float *)*pauVar23 = auVar29._0_4_ * -0.4342945;
          *(float *)(*pauVar23 + 4) = auVar29._4_4_ * -0.4342945;
          *(float *)(*pauVar23 + 8) = auVar29._8_4_ * -0.4342945;
          *(float *)(*pauVar23 + 0xc) = auVar29._12_4_ * -0.4342945;
          pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
          uVar19 = uVar24 + 7;
          uVar24 = uVar24 + 4;
        }
        auVar29 = vpcmpeqd_avx(auVar152,auVar152);
        if ((int)uVar24 < iVar26) {
          uVar17 = CONCAT44(0,~uVar24 + iVar26);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = uVar17;
          local_a0._0_16_ = vpshufd_avx(auVar41,0x44);
          local_d0 = vpor_avx(local_a0._0_16_,local_f0);
          local_e0 = vpor_avx(local_a0._0_16_,local_f0);
          uVar25 = 0;
          auVar139 = _DAT_00595120;
          local_a0._16_16_ = local_a0._0_16_;
          do {
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar25;
            auVar152 = vpshufd_avx(auVar42,0x44);
            auVar66._16_16_ = auVar152;
            auVar66._0_16_ = auVar152;
            auVar51 = vorps_avx(auVar66,_DAT_00595100);
            auVar139 = vorps_avx(auVar66,auVar139);
            auVar257 = vpor_avx(local_a0._16_16_,local_f0);
            auVar152 = vpcmpgtq_avx(auVar139._16_16_ ^ local_f0,auVar257);
            auVar127 = vpcmpgtq_avx(auVar139._0_16_ ^ local_f0,local_d0);
            auVar152 = vpackssdw_avx(auVar127,auVar152);
            auVar127 = vpcmpgtq_avx(auVar51._16_16_ ^ local_f0,auVar257);
            auVar129._0_4_ = auVar51._0_4_ ^ local_f0._0_4_;
            auVar129._4_4_ = auVar51._4_4_ ^ local_f0._4_4_;
            auVar129._8_4_ = auVar51._8_4_ ^ local_f0._8_4_;
            auVar129._12_4_ = auVar51._12_4_ ^ local_f0._12_4_;
            auVar257 = vpcmpgtq_avx(auVar129,local_e0);
            auVar127 = vpackssdw_avx(auVar257,auVar127);
            auVar152 = vpackssdw_avx(auVar127 ^ auVar29,auVar152 ^ auVar29);
            auVar127 = vpmovsxwd_avx(auVar152);
            auVar152 = vpunpckhwd_avx(auVar152,auVar152);
            local_c0._16_16_ = auVar152;
            local_c0._0_16_ = auVar127;
            local_120 = vmaskmovps_avx(local_c0,*(undefined1 (*) [32])(*pauVar23 + uVar25 * 4));
            local_150 = local_120._16_16_;
            local_160._0_4_ = log10f(local_120._16_4_);
            local_160._4_4_ = extraout_XMM0_Db_05;
            local_160._8_4_ = extraout_XMM0_Dc_05;
            local_160._12_4_ = extraout_XMM0_Dd_05;
            auVar152 = vmovshdup_avx(local_150);
            auVar74._0_4_ = log10f(auVar152._0_4_);
            auVar74._4_60_ = extraout_var_17;
            local_160 = vinsertps_avx(local_160,auVar74._0_16_,0x10);
            auVar152 = vpermilpd_avx(local_150,1);
            auVar95._0_4_ = log10f(auVar152._0_4_);
            auVar95._4_60_ = extraout_var_18;
            local_160 = vinsertps_avx(local_160,auVar95._0_16_,0x20);
            auVar152 = vpermilps_avx(local_150,0xff);
            auVar96._0_4_ = log10f(auVar152._0_4_);
            auVar96._4_60_ = extraout_var_19;
            local_150 = vinsertps_avx(local_160,auVar96._0_16_,0x30);
            local_160._0_4_ = log10f((float)local_120._0_4_);
            local_160._4_4_ = extraout_XMM0_Db_06;
            local_160._8_4_ = extraout_XMM0_Dc_06;
            local_160._12_4_ = extraout_XMM0_Dd_06;
            auVar152 = vmovshdup_avx(local_120._0_16_);
            auVar97._0_4_ = log10f(auVar152._0_4_);
            auVar97._4_60_ = extraout_var_20;
            local_160 = vinsertps_avx(local_160,auVar97._0_16_,0x10);
            auVar152 = vpermilpd_avx(local_120._0_16_,1);
            auVar98._0_4_ = log10f(auVar152._0_4_);
            auVar98._4_60_ = extraout_var_21;
            local_160 = vinsertps_avx(local_160,auVar98._0_16_,0x20);
            auVar152 = vpermilps_avx(local_120._0_16_,0xff);
            auVar99._0_4_ = log10f(auVar152._0_4_);
            auVar139 = _DAT_00595120;
            auVar99._4_60_ = extraout_var_22;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            auVar152 = vinsertps_avx(local_160,auVar99._0_16_,0x30);
            auVar67._16_16_ = local_150;
            auVar67._0_16_ = auVar152;
            auVar51 = vmaskmovps_avx(local_c0,auVar67);
            *(undefined1 (*) [32])(*pauVar23 + uVar25 * 4) = auVar51;
            uVar25 = uVar25 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar25);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != local_138);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}